

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::sse2::CurveNiMBIntersector1<4>::
     occluded_n<embree::sse2::OrientedCurve1Intersector1<embree::CatmullRomCurveT,3,4>,embree::sse2::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  long lVar2;
  float *pfVar3;
  undefined1 (*pauVar4) [12];
  Primitive *pPVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  ulong uVar11;
  Primitive PVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  Geometry *pGVar21;
  __int_type_conflict _Var22;
  long lVar23;
  long lVar24;
  long lVar25;
  bool bVar26;
  bool bVar27;
  undefined1 auVar28 [12];
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined3 uVar34;
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  undefined1 auVar64 [15];
  undefined1 auVar65 [15];
  undefined1 auVar66 [15];
  undefined1 auVar67 [15];
  unkbyte9 Var68;
  undefined1 auVar69 [11];
  undefined1 auVar70 [13];
  undefined1 auVar71 [12];
  undefined1 auVar72 [13];
  undefined1 auVar73 [12];
  undefined1 auVar74 [13];
  undefined1 auVar75 [12];
  undefined1 auVar76 [13];
  undefined1 auVar77 [12];
  undefined1 auVar78 [12];
  undefined6 uVar79;
  undefined1 auVar80 [12];
  undefined1 auVar81 [12];
  undefined1 auVar82 [12];
  undefined1 auVar83 [12];
  undefined1 auVar84 [12];
  undefined1 auVar85 [12];
  undefined1 auVar86 [12];
  undefined1 auVar87 [12];
  undefined1 auVar88 [12];
  undefined1 auVar89 [12];
  undefined1 auVar90 [15];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [15];
  undefined1 auVar94 [15];
  undefined1 auVar95 [15];
  undefined1 auVar96 [15];
  undefined1 auVar97 [15];
  undefined1 auVar98 [15];
  undefined1 auVar99 [13];
  undefined1 auVar100 [15];
  byte bVar101;
  ulong uVar102;
  ulong uVar103;
  RTCFilterFunctionN p_Var104;
  long lVar105;
  ulong uVar106;
  undefined4 uVar107;
  undefined8 unaff_RBP;
  long lVar109;
  byte bVar110;
  bool bVar111;
  uint uVar112;
  uint uVar113;
  uint uVar114;
  uint uVar115;
  float fVar116;
  undefined2 uVar143;
  float fVar145;
  undefined1 auVar117 [12];
  float fVar144;
  vfloat_impl<4> p00;
  undefined1 auVar118 [16];
  undefined1 auVar120 [16];
  undefined1 auVar123 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  short sVar146;
  int iVar147;
  undefined1 auVar149 [12];
  int iVar182;
  undefined1 in_XMM1 [16];
  undefined1 auVar151 [16];
  char cVar185;
  undefined1 auVar155 [16];
  undefined1 auVar159 [16];
  undefined1 auVar150 [12];
  undefined1 auVar163 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined8 extraout_XMM1_Qb;
  undefined8 extraout_XMM1_Qb_00;
  undefined1 auVar181 [16];
  char cVar186;
  char cVar211;
  float t1;
  float fVar187;
  float fVar188;
  undefined2 uVar212;
  float fVar213;
  float fVar215;
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined2 uVar214;
  undefined1 auVar192 [16];
  undefined1 auVar195 [16];
  undefined1 auVar198 [16];
  undefined1 auVar201 [16];
  float fVar216;
  float fVar217;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  char cVar227;
  float fVar218;
  float fVar219;
  float fVar228;
  float fVar230;
  undefined1 auVar222 [16];
  float fVar229;
  float fVar231;
  float fVar232;
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  float fVar233;
  undefined1 auVar234 [12];
  float fVar255;
  vfloat4 a;
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar240 [16];
  undefined1 auVar244 [16];
  float fVar256;
  float fVar257;
  float fVar258;
  float fVar259;
  float fVar260;
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  float fVar261;
  float fVar262;
  float fVar273;
  float fVar275;
  undefined1 auVar263 [16];
  float fVar274;
  float fVar276;
  float fVar277;
  float fVar278;
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  float fVar280;
  undefined1 auVar279 [16];
  float fVar281;
  undefined1 auVar282 [12];
  float fVar301;
  vfloat4 a_2;
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar283 [12];
  undefined1 auVar289 [16];
  undefined1 auVar293 [16];
  float fVar302;
  float fVar303;
  float fVar304;
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  float fVar305;
  undefined1 uVar317;
  float fVar318;
  float fVar319;
  undefined1 auVar306 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  float fVar320;
  float fVar335;
  float fVar337;
  undefined1 auVar322 [12];
  undefined1 auVar323 [16];
  float fVar321;
  undefined1 auVar327 [16];
  float fVar336;
  float fVar338;
  float fVar339;
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  float fVar340;
  float fVar341;
  float fVar348;
  float fVar351;
  vfloat4 a_1;
  undefined1 auVar342 [16];
  float fVar349;
  float fVar350;
  float fVar352;
  float fVar353;
  float fVar354;
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  float fVar355;
  float fVar356;
  float fVar363;
  float fVar365;
  vfloat4 a_3;
  undefined1 auVar357 [16];
  float fVar364;
  float fVar366;
  float fVar367;
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  float fVar368;
  float fVar369;
  float fVar377;
  float fVar378;
  undefined1 auVar370 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  float fVar379;
  float fVar380;
  float fVar388;
  float fVar390;
  undefined1 auVar381 [16];
  float fVar389;
  float fVar391;
  float fVar392;
  float fVar393;
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  float fVar394;
  float fVar400;
  float fVar401;
  float fVar402;
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  float fVar403;
  float fVar409;
  float fVar410;
  undefined1 auVar404 [16];
  float fVar411;
  undefined1 auVar407 [16];
  undefined1 auVar408 [16];
  vfloat_impl<4> p00_1;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined8 local_418;
  undefined1 local_408 [8];
  float fStack_400;
  float fStack_3fc;
  undefined1 local_3f8 [8];
  float fStack_3f0;
  float fStack_3ec;
  undefined4 local_3bc;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined1 local_338 [8];
  float fStack_330;
  float fStack_32c;
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [8];
  float fStack_2f0;
  float fStack_2ec;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  undefined1 local_2d8 [8];
  float fStack_2d0;
  float fStack_2cc;
  undefined1 local_2c8 [8];
  float fStack_2c0;
  float fStack_2bc;
  undefined8 local_2b8;
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  undefined8 uStack_2a0;
  ulong local_298;
  Primitive *local_290;
  RTCFilterFunctionNArguments local_288;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [16];
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [16];
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  uint auStack_208 [4];
  undefined8 local_1f8;
  float local_1f0;
  float local_1ec;
  float fStack_1e8;
  undefined4 local_1e4;
  uint local_1e0;
  uint local_1dc;
  uint local_1d8;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  undefined1 local_178 [16];
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [16];
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float afStack_78 [8];
  float afStack_58 [10];
  ulong uVar108;
  undefined1 auVar119 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar148 [12];
  undefined1 auVar152 [16];
  undefined1 auVar156 [16];
  undefined1 auVar160 [16];
  undefined1 auVar164 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar165 [16];
  int iVar183;
  int iVar184;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar220 [12];
  undefined1 auVar223 [16];
  undefined1 auVar221 [16];
  undefined1 auVar224 [16];
  undefined1 auVar237 [16];
  undefined1 auVar241 [16];
  undefined1 auVar238 [16];
  undefined1 auVar242 [16];
  undefined1 auVar239 [16];
  undefined1 auVar243 [16];
  undefined1 auVar286 [16];
  undefined1 auVar290 [16];
  undefined1 auVar287 [16];
  undefined1 auVar291 [16];
  undefined1 auVar288 [16];
  undefined1 auVar292 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 auVar405 [16];
  undefined1 auVar406 [16];
  
  PVar12 = prim[1];
  uVar102 = (ulong)(byte)PVar12;
  lVar109 = uVar102 * 0x25;
  uVar107 = *(undefined4 *)(prim + uVar102 * 4 + 6);
  uVar13 = *(undefined4 *)(prim + uVar102 * 5 + 6);
  uVar14 = *(undefined4 *)(prim + uVar102 * 6 + 6);
  uVar15 = *(undefined4 *)(prim + uVar102 * 0xf + 6);
  uVar16 = *(undefined4 *)(prim + (ulong)(byte)PVar12 * 0x10 + 6);
  uVar17 = *(undefined4 *)(prim + uVar102 * 0x11 + 6);
  uVar18 = *(undefined4 *)(prim + uVar102 * 0x1a + 6);
  uVar19 = *(undefined4 *)(prim + uVar102 * 0x1b + 6);
  pPVar5 = prim + lVar109 + 6;
  fVar365 = *(float *)(pPVar5 + 0xc);
  fVar116 = ((ray->org).field_0.m128[0] - *(float *)pPVar5) * fVar365;
  fVar144 = ((ray->org).field_0.m128[1] - *(float *)(pPVar5 + 4)) * fVar365;
  fVar145 = ((ray->org).field_0.m128[2] - *(float *)(pPVar5 + 8)) * fVar365;
  fVar355 = fVar365 * (ray->dir).field_0.m128[0];
  fVar363 = fVar365 * (ray->dir).field_0.m128[1];
  fVar365 = fVar365 * (ray->dir).field_0.m128[2];
  uVar20 = *(undefined4 *)(prim + uVar102 * 0x1c + 6);
  auVar37[0xd] = 0;
  auVar37._0_13_ = in_XMM1._0_13_;
  auVar37[0xe] = in_XMM1[7];
  auVar41[0xc] = in_XMM1[6];
  auVar41._0_12_ = in_XMM1._0_12_;
  auVar41._13_2_ = auVar37._13_2_;
  auVar45[0xb] = 0;
  auVar45._0_11_ = in_XMM1._0_11_;
  auVar45._12_3_ = auVar41._12_3_;
  auVar49[10] = in_XMM1[5];
  auVar49._0_10_ = in_XMM1._0_10_;
  auVar49._11_4_ = auVar45._11_4_;
  auVar53[9] = 0;
  auVar53._0_9_ = in_XMM1._0_9_;
  auVar53._10_5_ = auVar49._10_5_;
  auVar57[8] = in_XMM1[4];
  auVar57._0_8_ = in_XMM1._0_8_;
  auVar57._9_6_ = auVar53._9_6_;
  Var68 = CONCAT81(CONCAT71(auVar57._8_7_,(char)((uint)uVar13 >> 0x18)),in_XMM1[3]);
  auVar69._2_9_ = Var68;
  auVar69[1] = (char)((uint)uVar13 >> 0x10);
  auVar69[0] = in_XMM1[2];
  cVar211 = (char)((uint)uVar13 >> 8);
  auVar70._2_11_ = auVar69;
  auVar70[1] = cVar211;
  auVar70[0] = in_XMM1[1];
  cVar186 = (char)uVar13;
  sVar146 = CONCAT11(cVar186,in_XMM1[0]);
  auVar64._2_13_ = auVar70;
  auVar64._0_2_ = sVar146;
  uVar143 = (undefined2)Var68;
  auVar153._0_12_ = auVar64._0_12_;
  auVar153._12_2_ = uVar143;
  auVar153._14_2_ = uVar143;
  auVar152._12_4_ = auVar153._12_4_;
  auVar152._0_10_ = auVar64._0_10_;
  auVar152._10_2_ = auVar69._0_2_;
  auVar151._10_6_ = auVar152._10_6_;
  auVar151._0_8_ = auVar64._0_8_;
  auVar151._8_2_ = auVar69._0_2_;
  auVar71._4_8_ = auVar151._8_8_;
  auVar71._2_2_ = auVar70._0_2_;
  auVar71._0_2_ = auVar70._0_2_;
  iVar147 = (int)sVar146 >> 8;
  iVar182 = auVar71._0_4_ >> 0x18;
  auVar148._0_8_ = CONCAT44(iVar182,iVar147);
  auVar148._8_4_ = auVar151._8_4_ >> 0x18;
  auVar154._12_4_ = auVar152._12_4_ >> 0x18;
  auVar154._0_12_ = auVar148;
  fVar280 = (float)iVar182;
  cVar185 = cVar211 >> 7;
  auVar38[0xd] = 0;
  auVar38._0_13_ = auVar154._0_13_;
  auVar38[0xe] = cVar185;
  auVar42[0xc] = cVar185;
  auVar42._0_12_ = auVar148;
  auVar42._13_2_ = auVar38._13_2_;
  auVar46[0xb] = 0;
  auVar46._0_11_ = auVar148._0_11_;
  auVar46._12_3_ = auVar42._12_3_;
  auVar50[10] = cVar185;
  auVar50._0_10_ = auVar148._0_10_;
  auVar50._11_4_ = auVar46._11_4_;
  auVar54[9] = 0;
  auVar54._0_9_ = auVar148._0_9_;
  auVar54._10_5_ = auVar50._10_5_;
  auVar58[8] = cVar211;
  auVar58._0_8_ = auVar148._0_8_;
  auVar58._9_6_ = auVar54._9_6_;
  Var68 = CONCAT81(CONCAT71(auVar58._8_7_,(char)((uint)uVar14 >> 0x18)),(short)cVar186 >> 7);
  auVar61._6_9_ = Var68;
  auVar61[5] = (char)((uint)uVar14 >> 0x10);
  auVar61[4] = (undefined1)((short)cVar186 >> 7);
  auVar61._0_4_ = iVar147;
  cVar227 = (char)((uint)uVar14 >> 8);
  auVar72._2_11_ = auVar61._4_11_;
  auVar72[1] = cVar227;
  auVar72[0] = (undefined1)((short)cVar186 >> 7);
  cVar211 = (char)uVar14;
  auVar65._2_13_ = auVar72;
  auVar65._0_2_ = CONCAT11(cVar211,cVar186);
  uVar143 = (undefined2)Var68;
  auVar157._0_12_ = auVar65._0_12_;
  auVar157._12_2_ = uVar143;
  auVar157._14_2_ = uVar143;
  auVar156._12_4_ = auVar157._12_4_;
  auVar156._0_10_ = auVar65._0_10_;
  auVar156._10_2_ = auVar61._4_2_;
  auVar155._10_6_ = auVar156._10_6_;
  auVar155._0_8_ = auVar65._0_8_;
  auVar155._8_2_ = auVar61._4_2_;
  auVar73._4_8_ = auVar155._8_8_;
  auVar73._2_2_ = auVar72._0_2_;
  auVar73._0_2_ = auVar72._0_2_;
  iVar182 = (int)CONCAT11(cVar211,cVar186) >> 8;
  iVar183 = auVar73._0_4_ >> 0x18;
  auVar149._0_8_ = CONCAT44(iVar183,iVar182);
  auVar149._8_4_ = auVar155._8_4_ >> 0x18;
  auVar158._12_4_ = auVar156._12_4_ >> 0x18;
  auVar158._0_12_ = auVar149;
  fVar348 = (float)iVar183;
  cVar185 = cVar227 >> 7;
  auVar39[0xd] = 0;
  auVar39._0_13_ = auVar158._0_13_;
  auVar39[0xe] = cVar185;
  auVar43[0xc] = cVar185;
  auVar43._0_12_ = auVar149;
  auVar43._13_2_ = auVar39._13_2_;
  auVar47[0xb] = 0;
  auVar47._0_11_ = auVar149._0_11_;
  auVar47._12_3_ = auVar43._12_3_;
  auVar51[10] = cVar185;
  auVar51._0_10_ = auVar149._0_10_;
  auVar51._11_4_ = auVar47._11_4_;
  auVar55[9] = 0;
  auVar55._0_9_ = auVar149._0_9_;
  auVar55._10_5_ = auVar51._10_5_;
  auVar59[8] = cVar227;
  auVar59._0_8_ = auVar149._0_8_;
  auVar59._9_6_ = auVar55._9_6_;
  Var68 = CONCAT81(CONCAT71(auVar59._8_7_,(char)((uint)uVar16 >> 0x18)),(short)cVar211 >> 7);
  auVar62._6_9_ = Var68;
  auVar62[5] = (char)((uint)uVar16 >> 0x10);
  auVar62[4] = (undefined1)((short)cVar211 >> 7);
  auVar62._0_4_ = iVar182;
  cVar227 = (char)((uint)uVar16 >> 8);
  auVar74._2_11_ = auVar62._4_11_;
  auVar74[1] = cVar227;
  auVar74[0] = (undefined1)((short)cVar211 >> 7);
  cVar186 = (char)uVar16;
  auVar66._2_13_ = auVar74;
  auVar66._0_2_ = CONCAT11(cVar186,cVar211);
  uVar143 = (undefined2)Var68;
  auVar161._0_12_ = auVar66._0_12_;
  auVar161._12_2_ = uVar143;
  auVar161._14_2_ = uVar143;
  auVar160._12_4_ = auVar161._12_4_;
  auVar160._0_10_ = auVar66._0_10_;
  auVar160._10_2_ = auVar62._4_2_;
  auVar159._10_6_ = auVar160._10_6_;
  auVar159._0_8_ = auVar66._0_8_;
  auVar159._8_2_ = auVar62._4_2_;
  auVar75._4_8_ = auVar159._8_8_;
  auVar75._2_2_ = auVar74._0_2_;
  auVar75._0_2_ = auVar74._0_2_;
  iVar183 = (int)CONCAT11(cVar186,cVar211) >> 8;
  iVar184 = auVar75._0_4_ >> 0x18;
  auVar150._0_8_ = CONCAT44(iVar184,iVar183);
  auVar150._8_4_ = auVar159._8_4_ >> 0x18;
  auVar162._12_4_ = auVar160._12_4_ >> 0x18;
  auVar162._0_12_ = auVar150;
  fVar301 = (float)iVar184;
  cVar185 = cVar227 >> 7;
  auVar40[0xd] = 0;
  auVar40._0_13_ = auVar162._0_13_;
  auVar40[0xe] = cVar185;
  auVar44[0xc] = cVar185;
  auVar44._0_12_ = auVar150;
  auVar44._13_2_ = auVar40._13_2_;
  auVar48[0xb] = 0;
  auVar48._0_11_ = auVar150._0_11_;
  auVar48._12_3_ = auVar44._12_3_;
  auVar52[10] = cVar185;
  auVar52._0_10_ = auVar150._0_10_;
  auVar52._11_4_ = auVar48._11_4_;
  auVar56[9] = 0;
  auVar56._0_9_ = auVar150._0_9_;
  auVar56._10_5_ = auVar52._10_5_;
  auVar60[8] = cVar227;
  auVar60._0_8_ = auVar150._0_8_;
  auVar60._9_6_ = auVar56._9_6_;
  Var68 = CONCAT81(CONCAT71(auVar60._8_7_,(char)((uint)uVar17 >> 0x18)),(short)cVar186 >> 7);
  auVar63._6_9_ = Var68;
  auVar63[5] = (char)((uint)uVar17 >> 0x10);
  auVar63[4] = (undefined1)((short)cVar186 >> 7);
  auVar63._0_4_ = iVar183;
  auVar76._2_11_ = auVar63._4_11_;
  auVar76[1] = (char)((uint)uVar17 >> 8);
  auVar76[0] = (undefined1)((short)cVar186 >> 7);
  sVar146 = CONCAT11((char)uVar17,cVar186);
  auVar67._2_13_ = auVar76;
  auVar67._0_2_ = sVar146;
  uVar143 = (undefined2)Var68;
  auVar165._0_12_ = auVar67._0_12_;
  auVar165._12_2_ = uVar143;
  auVar165._14_2_ = uVar143;
  auVar164._12_4_ = auVar165._12_4_;
  auVar164._0_10_ = auVar67._0_10_;
  auVar164._10_2_ = auVar63._4_2_;
  auVar163._10_6_ = auVar164._10_6_;
  auVar163._0_8_ = auVar67._0_8_;
  auVar163._8_2_ = auVar63._4_2_;
  auVar77._4_8_ = auVar163._8_8_;
  auVar77._2_2_ = auVar76._0_2_;
  auVar77._0_2_ = auVar76._0_2_;
  fVar320 = (float)((int)sVar146 >> 8);
  fVar335 = (float)(auVar77._0_4_ >> 0x18);
  fVar337 = (float)(auVar163._8_4_ >> 0x18);
  fVar218 = fVar365 * fVar320;
  fVar228 = fVar365 * fVar335;
  auVar220._0_8_ = CONCAT44(fVar228,fVar218);
  auVar220._8_4_ = fVar365 * fVar337;
  auVar221._12_4_ = fVar365 * (float)(auVar164._12_4_ >> 0x18);
  auVar221._0_12_ = auVar220;
  fVar187 = ((ray->dir).field_0.m128[3] - *(float *)(prim + lVar109 + 0x16)) *
            *(float *)(prim + lVar109 + 0x1a);
  local_408[0] = (undefined1)uVar107;
  local_408[1] = (undefined1)((uint)uVar107 >> 8);
  local_408[2] = (undefined1)((uint)uVar107 >> 0x10);
  local_408[3] = (undefined1)((uint)uVar107 >> 0x18);
  auVar90[0xd] = 0;
  auVar90._0_13_ = auVar221._0_13_;
  auVar90[0xe] = (char)((uint)fVar228 >> 0x18);
  auVar93[0xc] = (char)((uint)fVar228 >> 0x10);
  auVar93._0_12_ = auVar220;
  auVar93._13_2_ = auVar90._13_2_;
  auVar94[0xb] = 0;
  auVar94._0_11_ = auVar220._0_11_;
  auVar94._12_3_ = auVar93._12_3_;
  auVar95[10] = (char)((uint)fVar228 >> 8);
  auVar95._0_10_ = auVar220._0_10_;
  auVar95._11_4_ = auVar94._11_4_;
  auVar96[9] = 0;
  auVar96._0_9_ = auVar220._0_9_;
  auVar96._10_5_ = auVar95._10_5_;
  auVar97[8] = SUB41(fVar228,0);
  auVar97._0_8_ = auVar220._0_8_;
  auVar97._9_6_ = auVar96._9_6_;
  Var68 = CONCAT81(CONCAT71(auVar97._8_7_,local_408[3]),(char)((uint)fVar218 >> 0x18));
  auVar98._6_9_ = Var68;
  auVar98[5] = local_408[2];
  auVar98[4] = (char)((uint)fVar218 >> 0x10);
  auVar98._0_4_ = fVar218;
  auVar99._2_11_ = auVar98._4_11_;
  auVar99[1] = local_408[1];
  auVar99[0] = (char)((uint)fVar218 >> 8);
  sVar146 = CONCAT11(local_408[0],SUB41(fVar218,0));
  auVar100._2_13_ = auVar99;
  auVar100._0_2_ = sVar146;
  uVar143 = (undefined2)Var68;
  auVar224._0_12_ = auVar100._0_12_;
  auVar224._12_2_ = uVar143;
  auVar224._14_2_ = uVar143;
  auVar223._12_4_ = auVar224._12_4_;
  auVar223._0_10_ = auVar100._0_10_;
  auVar223._10_2_ = auVar98._4_2_;
  auVar222._10_6_ = auVar223._10_6_;
  auVar222._0_8_ = auVar100._0_8_;
  auVar222._8_2_ = auVar98._4_2_;
  auVar78._4_8_ = auVar222._8_8_;
  auVar78._2_2_ = auVar99._0_2_;
  auVar78._0_2_ = auVar99._0_2_;
  fVar219 = (float)((int)sVar146 >> 8);
  fVar229 = (float)(auVar78._0_4_ >> 0x18);
  fVar230 = (float)(auVar222._8_4_ >> 0x18);
  uVar317 = (undefined1)((uint)uVar15 >> 0x18);
  uVar143 = CONCAT11(uVar317,uVar317);
  uVar317 = (undefined1)((uint)uVar15 >> 0x10);
  uVar6 = CONCAT35(CONCAT21(uVar143,uVar317),CONCAT14(uVar317,uVar15));
  uVar317 = (undefined1)((uint)uVar15 >> 8);
  uVar79 = CONCAT51(CONCAT41((int)((ulong)uVar6 >> 0x20),uVar317),uVar317);
  sVar146 = CONCAT11((char)uVar15,(char)uVar15);
  uVar108 = CONCAT62(uVar79,sVar146);
  auVar383._8_4_ = 0;
  auVar383._0_8_ = uVar108;
  auVar383._12_2_ = uVar143;
  auVar383._14_2_ = uVar143;
  uVar143 = (undefined2)((ulong)uVar6 >> 0x20);
  auVar382._12_4_ = auVar383._12_4_;
  auVar382._8_2_ = 0;
  auVar382._0_8_ = uVar108;
  auVar382._10_2_ = uVar143;
  auVar381._10_6_ = auVar382._10_6_;
  auVar381._8_2_ = uVar143;
  auVar381._0_8_ = uVar108;
  uVar143 = (undefined2)uVar79;
  auVar80._4_8_ = auVar381._8_8_;
  auVar80._2_2_ = uVar143;
  auVar80._0_2_ = uVar143;
  fVar379 = (float)((int)sVar146 >> 8);
  fVar388 = (float)(auVar80._0_4_ >> 0x18);
  fVar390 = (float)(auVar381._8_4_ >> 0x18);
  uVar317 = (undefined1)((uint)uVar18 >> 0x18);
  uVar143 = CONCAT11(uVar317,uVar317);
  uVar317 = (undefined1)((uint)uVar18 >> 0x10);
  uVar6 = CONCAT35(CONCAT21(uVar143,uVar317),CONCAT14(uVar317,uVar18));
  uVar317 = (undefined1)((uint)uVar18 >> 8);
  uVar79 = CONCAT51(CONCAT41((int)((ulong)uVar6 >> 0x20),uVar317),uVar317);
  sVar146 = CONCAT11((char)uVar18,(char)uVar18);
  uVar108 = CONCAT62(uVar79,sVar146);
  auVar308._8_4_ = 0;
  auVar308._0_8_ = uVar108;
  auVar308._12_2_ = uVar143;
  auVar308._14_2_ = uVar143;
  uVar143 = (undefined2)((ulong)uVar6 >> 0x20);
  auVar307._12_4_ = auVar308._12_4_;
  auVar307._8_2_ = 0;
  auVar307._0_8_ = uVar108;
  auVar307._10_2_ = uVar143;
  auVar306._10_6_ = auVar307._10_6_;
  auVar306._8_2_ = uVar143;
  auVar306._0_8_ = uVar108;
  uVar143 = (undefined2)uVar79;
  auVar81._4_8_ = auVar306._8_8_;
  auVar81._2_2_ = uVar143;
  auVar81._0_2_ = uVar143;
  fVar305 = (float)((int)sVar146 >> 8);
  fVar318 = (float)(auVar81._0_4_ >> 0x18);
  fVar319 = (float)(auVar306._8_4_ >> 0x18);
  uVar317 = (undefined1)((uint)uVar19 >> 0x18);
  uVar143 = CONCAT11(uVar317,uVar317);
  uVar317 = (undefined1)((uint)uVar19 >> 0x10);
  uVar6 = CONCAT35(CONCAT21(uVar143,uVar317),CONCAT14(uVar317,uVar19));
  uVar317 = (undefined1)((uint)uVar19 >> 8);
  uVar79 = CONCAT51(CONCAT41((int)((ulong)uVar6 >> 0x20),uVar317),uVar317);
  sVar146 = CONCAT11((char)uVar19,(char)uVar19);
  uVar108 = CONCAT62(uVar79,sVar146);
  auVar372._8_4_ = 0;
  auVar372._0_8_ = uVar108;
  auVar372._12_2_ = uVar143;
  auVar372._14_2_ = uVar143;
  uVar143 = (undefined2)((ulong)uVar6 >> 0x20);
  auVar371._12_4_ = auVar372._12_4_;
  auVar371._8_2_ = 0;
  auVar371._0_8_ = uVar108;
  auVar371._10_2_ = uVar143;
  auVar370._10_6_ = auVar371._10_6_;
  auVar370._8_2_ = uVar143;
  auVar370._0_8_ = uVar108;
  uVar143 = (undefined2)uVar79;
  auVar82._4_8_ = auVar370._8_8_;
  auVar82._2_2_ = uVar143;
  auVar82._0_2_ = uVar143;
  fVar368 = (float)((int)sVar146 >> 8);
  fVar377 = (float)(auVar82._0_4_ >> 0x18);
  fVar378 = (float)(auVar370._8_4_ >> 0x18);
  uVar317 = (undefined1)((uint)uVar20 >> 0x18);
  uVar143 = CONCAT11(uVar317,uVar317);
  uVar317 = (undefined1)((uint)uVar20 >> 0x10);
  uVar6 = CONCAT35(CONCAT21(uVar143,uVar317),CONCAT14(uVar317,uVar20));
  uVar317 = (undefined1)((uint)uVar20 >> 8);
  uVar79 = CONCAT51(CONCAT41((int)((ulong)uVar6 >> 0x20),uVar317),uVar317);
  sVar146 = CONCAT11((char)uVar20,(char)uVar20);
  uVar108 = CONCAT62(uVar79,sVar146);
  auVar406._8_4_ = 0;
  auVar406._0_8_ = uVar108;
  auVar406._12_2_ = uVar143;
  auVar406._14_2_ = uVar143;
  uVar143 = (undefined2)((ulong)uVar6 >> 0x20);
  auVar405._12_4_ = auVar406._12_4_;
  auVar405._8_2_ = 0;
  auVar405._0_8_ = uVar108;
  auVar405._10_2_ = uVar143;
  auVar404._10_6_ = auVar405._10_6_;
  auVar404._8_2_ = uVar143;
  auVar404._0_8_ = uVar108;
  uVar143 = (undefined2)uVar79;
  auVar83._4_8_ = auVar404._8_8_;
  auVar83._2_2_ = uVar143;
  auVar83._0_2_ = uVar143;
  fVar188 = (float)((int)sVar146 >> 8);
  fVar213 = (float)(auVar83._0_4_ >> 0x18);
  fVar215 = (float)(auVar404._8_4_ >> 0x18);
  fVar403 = fVar355 * fVar219 + fVar363 * (float)iVar147 + fVar365 * (float)iVar182;
  fVar409 = fVar355 * fVar229 + fVar363 * fVar280 + fVar365 * fVar348;
  fVar410 = fVar355 * fVar230 + fVar363 * (float)auVar148._8_4_ + fVar365 * (float)auVar149._8_4_;
  fVar411 = fVar355 * (float)(auVar223._12_4_ >> 0x18) +
            fVar363 * (float)auVar154._12_4_ + fVar365 * (float)auVar158._12_4_;
  fVar394 = fVar355 * fVar379 + fVar363 * (float)iVar183 + fVar218;
  fVar400 = fVar355 * fVar388 + fVar363 * fVar301 + fVar228;
  fVar401 = fVar355 * fVar390 + fVar363 * (float)auVar150._8_4_ + auVar220._8_4_;
  fVar402 = fVar355 * (float)(auVar382._12_4_ >> 0x18) +
            fVar363 * (float)auVar162._12_4_ + auVar221._12_4_;
  fVar261 = fVar355 * fVar305 + fVar363 * fVar368 + fVar365 * fVar188;
  fVar273 = fVar355 * fVar318 + fVar363 * fVar377 + fVar365 * fVar213;
  fVar275 = fVar355 * fVar319 + fVar363 * fVar378 + fVar365 * fVar215;
  fVar355 = fVar355 * (float)(auVar307._12_4_ >> 0x18) +
            fVar363 * (float)(auVar371._12_4_ >> 0x18) + fVar365 * (float)(auVar405._12_4_ >> 0x18);
  uVar6 = *(undefined8 *)(prim + uVar102 * 7 + 6);
  uVar7 = *(undefined8 *)(prim + uVar102 * 0xb + 6);
  uVar8 = *(undefined8 *)(prim + uVar102 * 9 + 6);
  uVar9 = *(undefined8 *)(prim + uVar102 * 0xd + 6);
  uVar108 = *(ulong *)(prim + uVar102 * 0x12 + 6);
  fVar363 = fVar219 * fVar116 + (float)iVar147 * fVar144 + (float)iVar182 * fVar145;
  fVar348 = fVar229 * fVar116 + fVar280 * fVar144 + fVar348 * fVar145;
  fVar231 = fVar230 * fVar116 + (float)auVar148._8_4_ * fVar144 + (float)auVar149._8_4_ * fVar145;
  fVar232 = (float)(auVar223._12_4_ >> 0x18) * fVar116 +
            (float)auVar154._12_4_ * fVar144 + (float)auVar158._12_4_ * fVar145;
  fVar379 = fVar379 * fVar116 + (float)iVar183 * fVar144 + fVar320 * fVar145;
  fVar388 = fVar388 * fVar116 + fVar301 * fVar144 + fVar335 * fVar145;
  fVar390 = fVar390 * fVar116 + (float)auVar150._8_4_ * fVar144 + fVar337 * fVar145;
  fVar392 = (float)(auVar382._12_4_ >> 0x18) * fVar116 +
            (float)auVar162._12_4_ * fVar144 + (float)(auVar164._12_4_ >> 0x18) * fVar145;
  fVar218 = fVar116 * fVar305 + fVar144 * fVar368 + fVar145 * fVar188;
  fVar219 = fVar116 * fVar318 + fVar144 * fVar377 + fVar145 * fVar213;
  fVar228 = fVar116 * fVar319 + fVar144 * fVar378 + fVar145 * fVar215;
  fVar229 = fVar116 * (float)(auVar307._12_4_ >> 0x18) +
            fVar144 * (float)(auVar371._12_4_ >> 0x18) + fVar145 * (float)(auVar405._12_4_ >> 0x18);
  fVar365 = (float)DAT_01f4bd50;
  fVar116 = DAT_01f4bd50._4_4_;
  fVar144 = DAT_01f4bd50._8_4_;
  fVar145 = DAT_01f4bd50._12_4_;
  uVar112 = -(uint)(fVar365 <= ABS(fVar403));
  uVar113 = -(uint)(fVar116 <= ABS(fVar409));
  uVar114 = -(uint)(fVar144 <= ABS(fVar410));
  uVar115 = -(uint)(fVar145 <= ABS(fVar411));
  auVar407._0_4_ = (uint)fVar403 & uVar112;
  auVar407._4_4_ = (uint)fVar409 & uVar113;
  auVar407._8_4_ = (uint)fVar410 & uVar114;
  auVar407._12_4_ = (uint)fVar411 & uVar115;
  auVar189._0_4_ = ~uVar112 & (uint)fVar365;
  auVar189._4_4_ = ~uVar113 & (uint)fVar116;
  auVar189._8_4_ = ~uVar114 & (uint)fVar144;
  auVar189._12_4_ = ~uVar115 & (uint)fVar145;
  auVar189 = auVar189 | auVar407;
  uVar112 = -(uint)(fVar365 <= ABS(fVar394));
  uVar113 = -(uint)(fVar116 <= ABS(fVar400));
  uVar114 = -(uint)(fVar144 <= ABS(fVar401));
  uVar115 = -(uint)(fVar145 <= ABS(fVar402));
  auVar395._0_4_ = (uint)fVar394 & uVar112;
  auVar395._4_4_ = (uint)fVar400 & uVar113;
  auVar395._8_4_ = (uint)fVar401 & uVar114;
  auVar395._12_4_ = (uint)fVar402 & uVar115;
  auVar284._0_4_ = ~uVar112 & (uint)fVar365;
  auVar284._4_4_ = ~uVar113 & (uint)fVar116;
  auVar284._8_4_ = ~uVar114 & (uint)fVar144;
  auVar284._12_4_ = ~uVar115 & (uint)fVar145;
  auVar284 = auVar284 | auVar395;
  uVar112 = -(uint)(fVar365 <= ABS(fVar261));
  uVar113 = -(uint)(fVar116 <= ABS(fVar273));
  uVar114 = -(uint)(fVar144 <= ABS(fVar275));
  uVar115 = -(uint)(fVar145 <= ABS(fVar355));
  auVar263._0_4_ = (uint)fVar261 & uVar112;
  auVar263._4_4_ = (uint)fVar273 & uVar113;
  auVar263._8_4_ = (uint)fVar275 & uVar114;
  auVar263._12_4_ = (uint)fVar355 & uVar115;
  auVar396._0_4_ = ~uVar112 & (uint)fVar365;
  auVar396._4_4_ = ~uVar113 & (uint)fVar116;
  auVar396._8_4_ = ~uVar114 & (uint)fVar144;
  auVar396._12_4_ = ~uVar115 & (uint)fVar145;
  auVar396 = auVar396 | auVar263;
  auVar235 = rcpps(_DAT_01f4bd50,auVar189);
  auVar236._0_4_ = auVar235._0_4_;
  auVar190._0_4_ = auVar189._0_4_ * auVar236._0_4_;
  fVar318 = auVar235._4_4_;
  auVar190._4_4_ = auVar189._4_4_ * fVar318;
  fVar319 = auVar235._8_4_;
  auVar190._8_4_ = auVar189._8_4_ * fVar319;
  fVar320 = auVar235._12_4_;
  auVar190._12_4_ = auVar189._12_4_ * fVar320;
  fVar337 = (1.0 - auVar190._0_4_) * auVar236._0_4_ + auVar236._0_4_;
  fVar318 = (1.0 - auVar190._4_4_) * fVar318 + fVar318;
  fVar319 = (1.0 - auVar190._8_4_) * fVar319 + fVar319;
  fVar320 = (1.0 - auVar190._12_4_) * fVar320 + fVar320;
  auVar191 = rcpps(auVar190,auVar284);
  fVar230 = auVar191._0_4_;
  fVar273 = auVar191._4_4_;
  fVar355 = auVar191._8_4_;
  fVar301 = auVar191._12_4_;
  fVar230 = (1.0 - auVar284._0_4_ * fVar230) * fVar230 + fVar230;
  fVar273 = (1.0 - auVar284._4_4_ * fVar273) * fVar273 + fVar273;
  fVar355 = (1.0 - auVar284._8_4_ * fVar355) * fVar355 + fVar355;
  fVar301 = (1.0 - auVar284._12_4_ * fVar301) * fVar301 + fVar301;
  auVar191 = rcpps(auVar191,auVar396);
  fVar261 = auVar191._0_4_;
  fVar275 = auVar191._4_4_;
  fVar280 = auVar191._8_4_;
  fVar305 = auVar191._12_4_;
  uVar10 = *(undefined8 *)(prim + uVar102 * 0x16 + 6);
  fVar261 = (1.0 - auVar396._0_4_ * fVar261) * fVar261 + fVar261;
  fVar275 = (1.0 - auVar396._4_4_ * fVar275) * fVar275 + fVar275;
  fVar280 = (1.0 - auVar396._8_4_ * fVar280) * fVar280 + fVar280;
  fVar305 = (1.0 - auVar396._12_4_ * fVar305) * fVar305 + fVar305;
  uVar103 = *(ulong *)(prim + uVar102 * 0x14 + 6);
  auVar239._0_12_ = auVar235._0_12_;
  auVar239._12_2_ = auVar235._6_2_;
  auVar239._14_2_ = (short)((ulong)uVar6 >> 0x30);
  auVar238._12_4_ = auVar239._12_4_;
  auVar238._0_10_ = auVar235._0_10_;
  auVar238._10_2_ = (short)((ulong)uVar6 >> 0x20);
  auVar237._10_6_ = auVar238._10_6_;
  auVar237._0_8_ = auVar235._0_8_;
  auVar237._8_2_ = auVar235._4_2_;
  auVar236._8_8_ = auVar237._8_8_;
  sVar146 = (short)((ulong)uVar6 >> 0x10);
  auVar236._6_2_ = sVar146;
  auVar236._4_2_ = auVar235._2_2_;
  auVar240._0_4_ = (int)(short)uVar6;
  iVar147 = auVar236._4_4_ >> 0x10;
  auVar234._0_8_ = CONCAT44(iVar147,auVar240._0_4_);
  auVar234._8_4_ = auVar237._8_4_ >> 0x10;
  auVar285._0_4_ = (float)auVar240._0_4_;
  fVar335 = (float)iVar147;
  auVar282._0_8_ = CONCAT44(fVar335,auVar285._0_4_);
  auVar282._8_4_ = (float)auVar234._8_4_;
  auVar243._12_2_ = sVar146 >> 0xf;
  auVar243._0_12_ = auVar234;
  auVar243._14_2_ = (short)((ulong)uVar7 >> 0x30);
  auVar242._12_4_ = auVar243._12_4_;
  auVar242._0_10_ = auVar234._0_10_;
  auVar242._10_2_ = (short)((ulong)uVar7 >> 0x20);
  auVar241._10_6_ = auVar242._10_6_;
  auVar241._8_2_ = sVar146;
  auVar241._0_8_ = auVar234._0_8_;
  auVar240._8_8_ = auVar241._8_8_;
  auVar240._6_2_ = (short)((ulong)uVar7 >> 0x10);
  auVar240._4_2_ = (short)uVar6 >> 0xf;
  uVar6 = *(undefined8 *)(prim + uVar102 * 0x18 + 6);
  auVar288._12_2_ = (short)((uint)fVar335 >> 0x10);
  auVar288._0_12_ = auVar282;
  auVar288._14_2_ = (short)((ulong)uVar8 >> 0x30);
  auVar287._12_4_ = auVar288._12_4_;
  auVar287._0_10_ = auVar282._0_10_;
  auVar287._10_2_ = (short)((ulong)uVar8 >> 0x20);
  auVar286._10_6_ = auVar287._10_6_;
  auVar286._8_2_ = SUB42(fVar335,0);
  auVar286._0_8_ = auVar282._0_8_;
  auVar285._8_8_ = auVar286._8_8_;
  sVar146 = (short)((ulong)uVar8 >> 0x10);
  auVar285._6_2_ = sVar146;
  auVar285._4_2_ = (short)((uint)auVar285._0_4_ >> 0x10);
  auVar289._0_4_ = (int)(short)uVar8;
  iVar147 = auVar285._4_4_ >> 0x10;
  auVar283._0_8_ = CONCAT44(iVar147,auVar289._0_4_);
  auVar283._8_4_ = auVar286._8_4_ >> 0x10;
  auVar323._0_4_ = (float)auVar289._0_4_;
  fVar368 = (float)iVar147;
  auVar322._0_8_ = CONCAT44(fVar368,auVar323._0_4_);
  auVar322._8_4_ = (float)auVar283._8_4_;
  auVar292._12_2_ = sVar146 >> 0xf;
  auVar292._0_12_ = auVar283;
  auVar292._14_2_ = (short)((ulong)uVar9 >> 0x30);
  auVar291._12_4_ = auVar292._12_4_;
  auVar291._0_10_ = auVar283._0_10_;
  auVar291._10_2_ = (short)((ulong)uVar9 >> 0x20);
  auVar290._10_6_ = auVar291._10_6_;
  auVar290._8_2_ = sVar146;
  auVar290._0_8_ = auVar283._0_8_;
  auVar289._8_8_ = auVar290._8_8_;
  auVar289._6_2_ = (short)((ulong)uVar9 >> 0x10);
  auVar289._4_2_ = (short)uVar8 >> 0xf;
  uVar143 = (undefined2)(uVar108 >> 0x30);
  auVar170._8_4_ = 0;
  auVar170._0_8_ = uVar108;
  auVar170._12_2_ = uVar143;
  auVar170._14_2_ = uVar143;
  uVar143 = (undefined2)(uVar108 >> 0x20);
  auVar235._12_4_ = auVar170._12_4_;
  auVar235._8_2_ = 0;
  auVar235._0_8_ = uVar108;
  auVar235._10_2_ = uVar143;
  auVar191._10_6_ = auVar235._10_6_;
  auVar191._8_2_ = uVar143;
  auVar191._0_8_ = uVar108;
  uVar143 = (undefined2)(uVar108 >> 0x10);
  auVar84._4_8_ = auVar191._8_8_;
  auVar84._2_2_ = uVar143;
  auVar84._0_2_ = uVar143;
  auVar118._0_4_ = (float)(int)(short)uVar108;
  fVar365 = (float)(auVar84._0_4_ >> 0x10);
  auVar117._0_8_ = CONCAT44(fVar365,auVar118._0_4_);
  auVar117._8_4_ = (float)(auVar191._8_4_ >> 0x10);
  auVar326._12_2_ = (short)((uint)fVar368 >> 0x10);
  auVar326._0_12_ = auVar322;
  auVar326._14_2_ = (short)((ulong)uVar10 >> 0x30);
  auVar325._12_4_ = auVar326._12_4_;
  auVar325._0_10_ = auVar322._0_10_;
  auVar325._10_2_ = (short)((ulong)uVar10 >> 0x20);
  auVar324._10_6_ = auVar325._10_6_;
  auVar324._8_2_ = SUB42(fVar368,0);
  auVar324._0_8_ = auVar322._0_8_;
  auVar323._8_8_ = auVar324._8_8_;
  auVar323._6_2_ = (short)((ulong)uVar10 >> 0x10);
  auVar323._4_2_ = (short)((uint)auVar323._0_4_ >> 0x10);
  uVar214 = (undefined2)(uVar103 >> 0x30);
  auVar203._12_2_ = (short)((uint)fVar365 >> 0x10);
  auVar203._0_12_ = auVar117;
  auVar203._14_2_ = uVar214;
  auVar329._12_4_ = auVar203._12_4_;
  auVar329._0_10_ = auVar117._0_10_;
  uVar212 = (undefined2)(uVar103 >> 0x20);
  auVar329._10_2_ = uVar212;
  auVar119._10_6_ = auVar329._10_6_;
  auVar119._8_2_ = SUB42(fVar365,0);
  auVar119._0_8_ = auVar117._0_8_;
  auVar118._8_8_ = auVar119._8_8_;
  uVar143 = (undefined2)(uVar103 >> 0x10);
  auVar118._6_2_ = uVar143;
  auVar118._4_2_ = (short)((uint)auVar118._0_4_ >> 0x10);
  fVar116 = (float)(auVar118._4_4_ >> 0x10);
  fVar188 = (float)(auVar119._8_4_ >> 0x10);
  auVar194._8_4_ = 0;
  auVar194._0_8_ = uVar103;
  auVar194._12_2_ = uVar214;
  auVar194._14_2_ = (short)((ulong)uVar6 >> 0x30);
  auVar193._12_4_ = auVar194._12_4_;
  auVar193._8_2_ = 0;
  auVar193._0_8_ = uVar103;
  auVar193._10_2_ = (short)((ulong)uVar6 >> 0x20);
  auVar192._10_6_ = auVar193._10_6_;
  auVar192._8_2_ = uVar212;
  auVar192._0_8_ = uVar103;
  auVar85._4_8_ = auVar192._8_8_;
  auVar85._2_2_ = (short)((ulong)uVar6 >> 0x10);
  auVar85._0_2_ = uVar143;
  uVar108 = *(ulong *)(prim + uVar102 * 0x1d + 6);
  uVar143 = (undefined2)(uVar108 >> 0x30);
  auVar122._8_4_ = 0;
  auVar122._0_8_ = uVar108;
  auVar122._12_2_ = uVar143;
  auVar122._14_2_ = uVar143;
  uVar143 = (undefined2)(uVar108 >> 0x20);
  auVar121._12_4_ = auVar122._12_4_;
  auVar121._8_2_ = 0;
  auVar121._0_8_ = uVar108;
  auVar121._10_2_ = uVar143;
  auVar120._10_6_ = auVar121._10_6_;
  auVar120._8_2_ = uVar143;
  auVar120._0_8_ = uVar108;
  uVar143 = (undefined2)(uVar108 >> 0x10);
  auVar86._4_8_ = auVar120._8_8_;
  auVar86._2_2_ = uVar143;
  auVar86._0_2_ = uVar143;
  fVar144 = (float)(auVar86._0_4_ >> 0x10);
  fVar213 = (float)(auVar120._8_4_ >> 0x10);
  uVar106 = *(ulong *)(prim + uVar102 * 0x21 + 6);
  uVar143 = (undefined2)(uVar106 >> 0x30);
  auVar197._8_4_ = 0;
  auVar197._0_8_ = uVar106;
  auVar197._12_2_ = uVar143;
  auVar197._14_2_ = uVar143;
  uVar143 = (undefined2)(uVar106 >> 0x20);
  auVar196._12_4_ = auVar197._12_4_;
  auVar196._8_2_ = 0;
  auVar196._0_8_ = uVar106;
  auVar196._10_2_ = uVar143;
  auVar195._10_6_ = auVar196._10_6_;
  auVar195._8_2_ = uVar143;
  auVar195._0_8_ = uVar106;
  uVar143 = (undefined2)(uVar106 >> 0x10);
  auVar87._4_8_ = auVar195._8_8_;
  auVar87._2_2_ = uVar143;
  auVar87._0_2_ = uVar143;
  uVar11 = *(ulong *)(prim + uVar102 * 0x1f + 6);
  uVar143 = (undefined2)(uVar11 >> 0x30);
  auVar125._8_4_ = 0;
  auVar125._0_8_ = uVar11;
  auVar125._12_2_ = uVar143;
  auVar125._14_2_ = uVar143;
  uVar143 = (undefined2)(uVar11 >> 0x20);
  auVar124._12_4_ = auVar125._12_4_;
  auVar124._8_2_ = 0;
  auVar124._0_8_ = uVar11;
  auVar124._10_2_ = uVar143;
  auVar123._10_6_ = auVar124._10_6_;
  auVar123._8_2_ = uVar143;
  auVar123._0_8_ = uVar11;
  uVar143 = (undefined2)(uVar11 >> 0x10);
  auVar88._4_8_ = auVar123._8_8_;
  auVar88._2_2_ = uVar143;
  auVar88._0_2_ = uVar143;
  fVar145 = (float)(auVar88._0_4_ >> 0x10);
  fVar215 = (float)(auVar123._8_4_ >> 0x10);
  uVar102 = *(ulong *)(prim + uVar102 * 0x23 + 6);
  uVar143 = (undefined2)(uVar102 >> 0x30);
  auVar200._8_4_ = 0;
  auVar200._0_8_ = uVar102;
  auVar200._12_2_ = uVar143;
  auVar200._14_2_ = uVar143;
  uVar143 = (undefined2)(uVar102 >> 0x20);
  auVar199._12_4_ = auVar200._12_4_;
  auVar199._8_2_ = 0;
  auVar199._0_8_ = uVar102;
  auVar199._10_2_ = uVar143;
  auVar198._10_6_ = auVar199._10_6_;
  auVar198._8_2_ = uVar143;
  auVar198._0_8_ = uVar102;
  uVar143 = (undefined2)(uVar102 >> 0x10);
  auVar89._4_8_ = auVar198._8_8_;
  auVar89._2_2_ = uVar143;
  auVar89._0_2_ = uVar143;
  auVar244._0_8_ =
       CONCAT44(((((float)(auVar240._4_4_ >> 0x10) - fVar335) * fVar187 + fVar335) - fVar348) *
                fVar318,((((float)(int)(short)uVar7 - auVar285._0_4_) * fVar187 + auVar285._0_4_) -
                        fVar363) * fVar337);
  auVar244._8_4_ =
       ((((float)(auVar241._8_4_ >> 0x10) - auVar282._8_4_) * fVar187 + auVar282._8_4_) - fVar231) *
       fVar319;
  auVar244._12_4_ =
       ((((float)(auVar242._12_4_ >> 0x10) - (float)(auVar238._12_4_ >> 0x10)) * fVar187 +
        (float)(auVar238._12_4_ >> 0x10)) - fVar232) * fVar320;
  auVar293._0_4_ =
       ((((float)(int)(short)uVar9 - auVar323._0_4_) * fVar187 + auVar323._0_4_) - fVar363) *
       fVar337;
  auVar293._4_4_ =
       ((((float)(auVar289._4_4_ >> 0x10) - fVar368) * fVar187 + fVar368) - fVar348) * fVar318;
  auVar293._8_4_ =
       ((((float)(auVar290._8_4_ >> 0x10) - auVar322._8_4_) * fVar187 + auVar322._8_4_) - fVar231) *
       fVar319;
  auVar293._12_4_ =
       ((((float)(auVar291._12_4_ >> 0x10) - (float)(auVar287._12_4_ >> 0x10)) * fVar187 +
        (float)(auVar287._12_4_ >> 0x10)) - fVar232) * fVar320;
  auVar327._0_8_ =
       CONCAT44(((((float)(auVar323._4_4_ >> 0x10) - fVar365) * fVar187 + fVar365) - fVar388) *
                fVar273,((((float)(int)(short)uVar10 - auVar118._0_4_) * fVar187 + auVar118._0_4_) -
                        fVar379) * fVar230);
  auVar327._8_4_ =
       ((((float)(auVar324._8_4_ >> 0x10) - auVar117._8_4_) * fVar187 + auVar117._8_4_) - fVar390) *
       fVar355;
  auVar327._12_4_ =
       ((((float)(auVar325._12_4_ >> 0x10) - (float)(auVar235._12_4_ >> 0x10)) * fVar187 +
        (float)(auVar235._12_4_ >> 0x10)) - fVar392) * fVar301;
  auVar342._0_4_ =
       ((((float)(int)(short)uVar6 - (float)(int)(short)uVar103) * fVar187 +
        (float)(int)(short)uVar103) - fVar379) * fVar230;
  auVar342._4_4_ =
       ((((float)(auVar85._0_4_ >> 0x10) - fVar116) * fVar187 + fVar116) - fVar388) * fVar273;
  auVar342._8_4_ =
       ((((float)(auVar192._8_4_ >> 0x10) - fVar188) * fVar187 + fVar188) - fVar390) * fVar355;
  auVar342._12_4_ =
       ((((float)(auVar193._12_4_ >> 0x10) - (float)(auVar329._12_4_ >> 0x10)) * fVar187 +
        (float)(auVar329._12_4_ >> 0x10)) - fVar392) * fVar301;
  auVar357._0_8_ =
       CONCAT44(((((float)(auVar87._0_4_ >> 0x10) - fVar144) * fVar187 + fVar144) - fVar219) *
                fVar275,((((float)(int)(short)uVar106 - (float)(int)(short)uVar108) * fVar187 +
                         (float)(int)(short)uVar108) - fVar218) * fVar261);
  auVar357._8_4_ =
       ((((float)(auVar195._8_4_ >> 0x10) - fVar213) * fVar187 + fVar213) - fVar228) * fVar280;
  auVar357._12_4_ =
       ((((float)(auVar196._12_4_ >> 0x10) - (float)(auVar121._12_4_ >> 0x10)) * fVar187 +
        (float)(auVar121._12_4_ >> 0x10)) - fVar229) * fVar305;
  auVar373._0_4_ =
       ((((float)(int)(short)uVar102 - (float)(int)(short)uVar11) * fVar187 +
        (float)(int)(short)uVar11) - fVar218) * fVar261;
  auVar373._4_4_ =
       ((((float)(auVar89._0_4_ >> 0x10) - fVar145) * fVar187 + fVar145) - fVar219) * fVar275;
  auVar373._8_4_ =
       ((((float)(auVar198._8_4_ >> 0x10) - fVar215) * fVar187 + fVar215) - fVar228) * fVar280;
  auVar373._12_4_ =
       ((((float)(auVar199._12_4_ >> 0x10) - (float)(auVar124._12_4_ >> 0x10)) * fVar187 +
        (float)(auVar124._12_4_ >> 0x10)) - fVar229) * fVar305;
  auVar201._8_4_ = auVar244._8_4_;
  auVar201._0_8_ = auVar244._0_8_;
  auVar201._12_4_ = auVar244._12_4_;
  auVar235 = minps(auVar201,auVar293);
  auVar126._8_4_ = auVar327._8_4_;
  auVar126._0_8_ = auVar327._0_8_;
  auVar126._12_4_ = auVar327._12_4_;
  auVar191 = minps(auVar126,auVar342);
  auVar235 = maxps(auVar235,auVar191);
  auVar127._8_4_ = auVar357._8_4_;
  auVar127._0_8_ = auVar357._0_8_;
  auVar127._12_4_ = auVar357._12_4_;
  auVar191 = minps(auVar127,auVar373);
  uVar107 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar166._4_4_ = uVar107;
  auVar166._0_4_ = uVar107;
  auVar166._8_4_ = uVar107;
  auVar166._12_4_ = uVar107;
  auVar191 = maxps(auVar191,auVar166);
  auVar191 = maxps(auVar235,auVar191);
  local_188 = auVar191._0_4_ * 0.99999964;
  fStack_184 = auVar191._4_4_ * 0.99999964;
  fStack_180 = auVar191._8_4_ * 0.99999964;
  fStack_17c = auVar191._12_4_ * 0.99999964;
  auVar191 = maxps(auVar244,auVar293);
  auVar235 = maxps(auVar327,auVar342);
  auVar191 = minps(auVar191,auVar235);
  auVar235 = maxps(auVar357,auVar373);
  fVar365 = ray->tfar;
  auVar128._4_4_ = fVar365;
  auVar128._0_4_ = fVar365;
  auVar128._8_4_ = fVar365;
  auVar128._12_4_ = fVar365;
  auVar235 = minps(auVar235,auVar128);
  auVar191 = minps(auVar191,auVar235);
  auVar167._0_4_ = -(uint)(PVar12 != (Primitive)0x0 && local_188 <= auVar191._0_4_ * 1.0000004);
  auVar167._4_4_ = -(uint)(1 < (byte)PVar12 && fStack_184 <= auVar191._4_4_ * 1.0000004);
  auVar167._8_4_ = -(uint)(2 < (byte)PVar12 && fStack_180 <= auVar191._8_4_ * 1.0000004);
  auVar167._12_4_ = -(uint)(3 < (byte)PVar12 && fStack_17c <= auVar191._12_4_ * 1.0000004);
  uVar107 = movmskps((int)unaff_RBP,auVar167);
  uVar108 = CONCAT44((int)((ulong)unaff_RBP >> 0x20),uVar107);
  local_178._0_4_ = -(uint)((int)mm_lookupmask_ps._240_4_ < 0);
  local_178._4_4_ = -(uint)((int)mm_lookupmask_ps._244_4_ < 0);
  local_178._8_4_ = -(uint)((int)mm_lookupmask_ps._248_4_ < 0);
  local_178._12_4_ = 0;
  local_290 = prim;
LAB_003cf7c9:
  if (uVar108 == 0) {
LAB_003d1c84:
    return uVar108 != 0;
  }
  lVar109 = 0;
  if (uVar108 != 0) {
    for (; (uVar108 >> lVar109 & 1) == 0; lVar109 = lVar109 + 1) {
    }
  }
  uVar112 = *(uint *)(local_290 + 2);
  uVar113 = *(uint *)(local_290 + lVar109 * 4 + 6);
  pGVar21 = (context->scene->geometries).items[uVar112].ptr;
  fVar365 = pGVar21->fnumTimeSegments;
  fVar116 = (pGVar21->time_range).lower;
  fVar144 = (((ray->dir).field_0.m128[3] - fVar116) / ((pGVar21->time_range).upper - fVar116)) *
            fVar365;
  fVar116 = floorf(fVar144);
  fVar365 = fVar365 + -1.0;
  if (fVar365 <= fVar116) {
    fVar116 = fVar365;
  }
  fVar365 = 0.0;
  if (0.0 <= fVar116) {
    fVar365 = fVar116;
  }
  fVar144 = fVar144 - fVar365;
  uVar103 = (ulong)*(uint *)(*(long *)&pGVar21->field_0x58 +
                            (ulong)uVar113 *
                            pGVar21[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                            _M_i);
  _Var22 = pGVar21[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar105 = (long)(int)fVar365 * 0x38;
  lVar23 = *(long *)(_Var22 + lVar105);
  lVar24 = *(long *)(_Var22 + 0x10 + lVar105);
  pfVar3 = (float *)(lVar23 + lVar24 * uVar103);
  fVar365 = *pfVar3;
  fVar116 = pfVar3[1];
  fVar145 = pfVar3[2];
  fVar188 = pfVar3[3];
  lVar109 = uVar103 + 1;
  pauVar4 = (undefined1 (*) [12])(lVar23 + lVar24 * lVar109);
  auVar71 = *pauVar4;
  fVar213 = *(float *)pauVar4[1];
  lVar1 = uVar103 + 2;
  pfVar3 = (float *)(lVar23 + lVar24 * lVar1);
  fVar215 = *pfVar3;
  fVar218 = pfVar3[1];
  fVar219 = pfVar3[2];
  fVar228 = pfVar3[3];
  lVar2 = uVar103 + 3;
  pfVar3 = (float *)(lVar23 + lVar24 * lVar2);
  fVar229 = *pfVar3;
  fVar187 = pfVar3[1];
  fVar230 = pfVar3[2];
  fVar261 = pfVar3[3];
  lVar23 = *(long *)&pGVar21[4].fnumTimeSegments;
  lVar24 = *(long *)(lVar23 + lVar105);
  lVar25 = *(long *)(lVar23 + 0x10 + lVar105);
  pfVar3 = (float *)(lVar24 + lVar25 * uVar103);
  fVar273 = *pfVar3;
  fVar275 = pfVar3[1];
  fVar355 = pfVar3[2];
  fVar280 = pfVar3[3];
  pfVar3 = (float *)(lVar24 + lVar25 * lVar109);
  fVar301 = *pfVar3;
  fVar305 = pfVar3[1];
  fVar363 = pfVar3[2];
  fVar348 = pfVar3[3];
  pfVar3 = (float *)(lVar24 + lVar25 * lVar1);
  fVar231 = *pfVar3;
  fVar232 = pfVar3[1];
  fVar318 = pfVar3[2];
  fVar319 = pfVar3[3];
  pfVar3 = (float *)(lVar24 + lVar25 * lVar2);
  fVar320 = *pfVar3;
  fVar335 = pfVar3[1];
  fVar337 = pfVar3[2];
  fVar368 = pfVar3[3];
  fVar377 = *(float *)*pauVar4 * 0.0;
  fVar378 = *(float *)(*pauVar4 + 4) * 0.0;
  fVar379 = *(float *)(*pauVar4 + 8) * 0.0;
  fVar410 = (fVar215 * 0.5 + fVar229 * 0.0 + fVar377) - fVar365 * 0.5;
  fVar411 = (fVar218 * 0.5 + fVar187 * 0.0 + fVar378) - fVar116 * 0.5;
  fVar216 = (fVar219 * 0.5 + fVar230 * 0.0 + fVar379) - fVar145 * 0.5;
  fVar217 = (fVar228 * 0.5 + fVar261 * 0.0 + fVar213 * 0.0) - fVar188 * 0.5;
  fVar356 = (fVar231 * 0.5 + fVar320 * 0.0 + fVar301 * 0.0) - fVar273 * 0.5;
  fVar364 = (fVar232 * 0.5 + fVar335 * 0.0 + fVar305 * 0.0) - fVar275 * 0.5;
  fVar366 = (fVar318 * 0.5 + fVar337 * 0.0 + fVar363 * 0.0) - fVar355 * 0.5;
  fVar367 = (fVar319 * 0.5 + fVar368 * 0.0 + fVar348 * 0.0) - fVar280 * 0.5;
  fVar388 = fVar215 * 0.0 + fVar229 * -0.0 + *(float *)*pauVar4 + fVar365 * -0.0;
  fVar390 = fVar218 * 0.0 + fVar187 * -0.0 + *(float *)(*pauVar4 + 4) + fVar116 * -0.0;
  fVar392 = fVar219 * 0.0 + fVar230 * -0.0 + *(float *)(*pauVar4 + 8) + fVar145 * -0.0;
  fVar400 = fVar228 * 0.0 + fVar261 * -0.0 + fVar213 + fVar188 * -0.0;
  fVar380 = fVar231 * 0.0 + fVar320 * -0.0 + fVar301 + fVar273 * -0.0;
  fVar389 = fVar232 * 0.0 + fVar335 * -0.0 + fVar305 + fVar275 * -0.0;
  fVar391 = fVar318 * 0.0 + fVar337 * -0.0 + fVar363 + fVar355 * -0.0;
  fVar393 = fVar319 * 0.0 + fVar368 * -0.0 + fVar348 + fVar280 * -0.0;
  fVar377 = fVar229 * -0.0 + fVar215 + fVar377 + fVar365 * -0.0;
  fVar378 = fVar187 * -0.0 + fVar218 + fVar378 + fVar116 * -0.0;
  fVar379 = fVar230 * -0.0 + fVar219 + fVar379 + fVar145 * -0.0;
  fVar394 = fVar261 * -0.0 + fVar228 + fVar213 * 0.0 + fVar188 * -0.0;
  local_3f8._0_4_ = auVar71._0_4_;
  local_3f8._4_4_ = auVar71._4_4_;
  fStack_3f0 = auVar71._8_4_;
  fVar401 = fVar365 * 0.0 + ((fVar229 * 0.5 + fVar215 * 0.0) - (float)local_3f8._0_4_ * 0.5);
  fVar402 = fVar116 * 0.0 + ((fVar187 * 0.5 + fVar218 * 0.0) - (float)local_3f8._4_4_ * 0.5);
  fVar403 = fVar145 * 0.0 + ((fVar230 * 0.5 + fVar219 * 0.0) - fStack_3f0 * 0.5);
  fVar409 = fVar188 * 0.0 + ((fVar261 * 0.5 + fVar228 * 0.0) - fVar213 * 0.5);
  fVar213 = fVar320 * -0.0 + fVar231 + fVar301 * 0.0 + fVar273 * -0.0;
  fVar215 = fVar335 * -0.0 + fVar232 + fVar305 * 0.0 + fVar275 * -0.0;
  fVar218 = fVar337 * -0.0 + fVar318 + fVar363 * 0.0 + fVar355 * -0.0;
  fVar228 = fVar368 * -0.0 + fVar319 + fVar348 * 0.0 + fVar280 * -0.0;
  fVar365 = fVar273 * 0.0 + ((fVar320 * 0.5 + fVar231 * 0.0) - fVar301 * 0.5);
  fVar116 = fVar275 * 0.0 + ((fVar335 * 0.5 + fVar232 * 0.0) - fVar305 * 0.5);
  fVar145 = fVar355 * 0.0 + ((fVar337 * 0.5 + fVar318 * 0.0) - fVar363 * 0.5);
  fVar188 = fVar280 * 0.0 + ((fVar368 * 0.5 + fVar319 * 0.0) - fVar348 * 0.5);
  fVar348 = fVar411 * fVar380 - fVar389 * fVar410;
  fVar231 = fVar216 * fVar389 - fVar391 * fVar411;
  fVar232 = fVar410 * fVar391 - fVar380 * fVar216;
  fVar318 = fVar217 * fVar393 - fVar393 * fVar217;
  fVar261 = fVar411 * fVar356 - fVar364 * fVar410;
  fVar275 = fVar216 * fVar364 - fVar366 * fVar411;
  fVar355 = fVar410 * fVar366 - fVar356 * fVar216;
  fVar219 = fVar402 * fVar213 - fVar215 * fVar401;
  fVar229 = fVar403 * fVar215 - fVar218 * fVar402;
  fVar187 = fVar401 * fVar218 - fVar213 * fVar403;
  fVar230 = fVar409 * fVar228 - fVar228 * fVar409;
  fVar213 = fVar402 * fVar365 - fVar116 * fVar401;
  fVar215 = fVar403 * fVar116 - fVar145 * fVar402;
  fVar145 = fVar401 * fVar145 - fVar365 * fVar403;
  fVar301 = fVar232 * fVar232 + fVar231 * fVar231 + fVar348 * fVar348;
  auVar235 = ZEXT416((uint)fVar301);
  auVar191 = rsqrtss(ZEXT416((uint)fVar301),auVar235);
  fVar365 = auVar191._0_4_;
  fVar305 = fVar365 * 1.5 - fVar365 * fVar365 * fVar301 * 0.5 * fVar365;
  fVar319 = fVar348 * fVar261 + fVar232 * fVar355 + fVar231 * fVar275;
  fVar365 = fVar318 * fVar305;
  auVar191 = rcpss(auVar235,auVar235);
  fVar273 = (2.0 - fVar301 * auVar191._0_4_) * auVar191._0_4_;
  fVar280 = fVar187 * fVar187 + fVar229 * fVar229 + fVar219 * fVar219;
  auVar191 = ZEXT416((uint)fVar280);
  auVar235 = rsqrtss(ZEXT416((uint)fVar280),auVar191);
  fVar116 = auVar235._0_4_;
  fVar228 = fVar116 * 1.5 - fVar116 * fVar116 * fVar280 * 0.5 * fVar116;
  fVar363 = fVar219 * fVar213 + fVar187 * fVar145 + fVar229 * fVar215;
  fVar218 = fVar230 * fVar228;
  auVar191 = rcpss(auVar191,auVar191);
  fVar116 = (2.0 - fVar280 * auVar191._0_4_) * auVar191._0_4_;
  fVar281 = fVar400 * fVar231 * fVar305;
  fVar302 = fVar400 * fVar232 * fVar305;
  fVar303 = fVar400 * fVar348 * fVar305;
  fVar304 = fVar400 * fVar365;
  fVar340 = fVar388 - fVar281;
  fVar349 = fVar390 - fVar302;
  fVar351 = fVar392 - fVar303;
  fVar353 = fVar400 - fVar304;
  fVar321 = fVar400 * fVar273 * (fVar301 * fVar275 - fVar319 * fVar231) * fVar305 +
            fVar217 * fVar231 * fVar305;
  fVar336 = fVar400 * fVar273 * (fVar301 * fVar355 - fVar319 * fVar232) * fVar305 +
            fVar217 * fVar232 * fVar305;
  fVar338 = fVar400 * fVar273 * (fVar301 * fVar261 - fVar319 * fVar348) * fVar305 +
            fVar217 * fVar348 * fVar305;
  fVar339 = fVar400 * fVar273 * (fVar301 * (fVar217 * fVar367 - fVar367 * fVar217) -
                                fVar319 * fVar318) * fVar305 + fVar217 * fVar365;
  fVar281 = fVar281 + fVar388;
  fVar302 = fVar302 + fVar390;
  fVar303 = fVar303 + fVar392;
  fVar304 = fVar304 + fVar400;
  fVar388 = fVar394 * fVar229 * fVar228;
  fVar390 = fVar394 * fVar187 * fVar228;
  fVar392 = fVar394 * fVar219 * fVar228;
  fVar400 = fVar394 * fVar218;
  fVar393 = fVar377 - fVar388;
  fVar255 = fVar378 - fVar390;
  fVar257 = fVar379 - fVar392;
  fVar259 = fVar394 - fVar400;
  fVar356 = fVar394 * fVar116 * (fVar280 * fVar215 - fVar363 * fVar229) * fVar228 +
            fVar409 * fVar229 * fVar228;
  fVar364 = fVar394 * fVar116 * (fVar280 * fVar145 - fVar363 * fVar187) * fVar228 +
            fVar409 * fVar187 * fVar228;
  fVar367 = fVar394 * fVar116 * (fVar280 * fVar213 - fVar363 * fVar219) * fVar228 +
            fVar409 * fVar219 * fVar228;
  fVar389 = fVar394 * fVar116 * (fVar280 * (fVar409 * fVar188 - fVar188 * fVar409) -
                                fVar363 * fVar230) * fVar228 + fVar409 * fVar218;
  fVar388 = fVar388 + fVar377;
  fVar390 = fVar390 + fVar378;
  fVar392 = fVar392 + fVar379;
  fVar400 = fVar400 + fVar394;
  lVar24 = *(long *)(_Var22 + 0x38 + lVar105);
  lVar25 = *(long *)(_Var22 + 0x48 + lVar105);
  pfVar3 = (float *)(lVar24 + lVar25 * uVar103);
  fVar365 = *pfVar3;
  fVar116 = pfVar3[1];
  fVar145 = pfVar3[2];
  fVar188 = pfVar3[3];
  pfVar3 = (float *)(lVar24 + lVar25 * lVar109);
  fVar213 = *pfVar3;
  fVar215 = pfVar3[1];
  fVar218 = pfVar3[2];
  fVar219 = pfVar3[3];
  pfVar3 = (float *)(lVar24 + lVar25 * lVar1);
  fVar228 = *pfVar3;
  fVar229 = pfVar3[1];
  fVar187 = pfVar3[2];
  fVar230 = pfVar3[3];
  pfVar3 = (float *)(lVar24 + lVar25 * lVar2);
  fVar261 = *pfVar3;
  fVar273 = pfVar3[1];
  fVar275 = pfVar3[2];
  fVar355 = pfVar3[3];
  fVar233 = (fVar228 * 0.5 + fVar261 * 0.0 + fVar213 * 0.0) - fVar365 * 0.5;
  fVar256 = (fVar229 * 0.5 + fVar273 * 0.0 + fVar215 * 0.0) - fVar116 * 0.5;
  fVar258 = (fVar187 * 0.5 + fVar275 * 0.0 + fVar218 * 0.0) - fVar145 * 0.5;
  fVar260 = (fVar230 * 0.5 + fVar355 * 0.0 + fVar219 * 0.0) - fVar188 * 0.5;
  lVar24 = *(long *)(lVar23 + 0x38 + lVar105);
  lVar23 = *(long *)(lVar23 + 0x48 + lVar105);
  uVar103 = uVar103 * lVar23;
  pfVar3 = (float *)(lVar24 + lVar23 * lVar2);
  fVar280 = *pfVar3;
  fVar301 = pfVar3[1];
  fVar305 = pfVar3[2];
  fVar363 = pfVar3[3];
  pfVar3 = (float *)(lVar24 + lVar1 * lVar23);
  fVar348 = *pfVar3;
  fVar231 = pfVar3[1];
  fVar232 = pfVar3[2];
  fVar318 = pfVar3[3];
  pfVar3 = (float *)(lVar24 + lVar109 * lVar23);
  fVar319 = *pfVar3;
  fVar320 = pfVar3[1];
  fVar335 = pfVar3[2];
  fVar337 = pfVar3[3];
  pfVar3 = (float *)(lVar24 + uVar103);
  fVar368 = *pfVar3;
  fVar377 = pfVar3[1];
  fVar378 = pfVar3[2];
  fVar379 = pfVar3[3];
  fVar341 = (fVar348 * 0.5 + fVar280 * 0.0 + fVar319 * 0.0) - fVar368 * 0.5;
  fVar350 = (fVar231 * 0.5 + fVar301 * 0.0 + fVar320 * 0.0) - fVar377 * 0.5;
  fVar352 = (fVar232 * 0.5 + fVar305 * 0.0 + fVar335 * 0.0) - fVar378 * 0.5;
  fVar354 = (fVar318 * 0.5 + fVar363 * 0.0 + fVar337 * 0.0) - fVar379 * 0.5;
  fVar394 = fVar228 * 0.0 + fVar261 * -0.0 + fVar213 + fVar365 * -0.0;
  fVar366 = fVar229 * 0.0 + fVar273 * -0.0 + fVar215 + fVar116 * -0.0;
  fVar380 = fVar187 * 0.0 + fVar275 * -0.0 + fVar218 + fVar145 * -0.0;
  fVar391 = fVar230 * 0.0 + fVar355 * -0.0 + fVar219 + fVar188 * -0.0;
  fVar262 = fVar261 * -0.0 + fVar228 + fVar213 * 0.0 + fVar365 * -0.0;
  fVar274 = fVar273 * -0.0 + fVar229 + fVar215 * 0.0 + fVar116 * -0.0;
  fVar276 = fVar275 * -0.0 + fVar187 + fVar218 * 0.0 + fVar145 * -0.0;
  fVar277 = fVar355 * -0.0 + fVar230 + fVar219 * 0.0 + fVar188 * -0.0;
  fVar261 = fVar365 * 0.0 + ((fVar261 * 0.5 + fVar228 * 0.0) - fVar213 * 0.5);
  fVar273 = fVar116 * 0.0 + ((fVar273 * 0.5 + fVar229 * 0.0) - fVar215 * 0.5);
  fVar275 = fVar145 * 0.0 + ((fVar275 * 0.5 + fVar187 * 0.0) - fVar218 * 0.5);
  fVar278 = fVar188 * 0.0 + ((fVar355 * 0.5 + fVar230 * 0.0) - fVar219 * 0.5);
  fVar218 = fVar348 * 0.0 + fVar280 * -0.0 + fVar319 + fVar368 * -0.0;
  fVar229 = fVar231 * 0.0 + fVar301 * -0.0 + fVar320 + fVar377 * -0.0;
  fVar187 = fVar232 * 0.0 + fVar305 * -0.0 + fVar335 + fVar378 * -0.0;
  fVar230 = fVar318 * 0.0 + fVar363 * -0.0 + fVar337 + fVar379 * -0.0;
  fVar365 = fVar280 * -0.0 + fVar348 + fVar319 * 0.0 + fVar368 * -0.0;
  fVar116 = fVar301 * -0.0 + fVar231 + fVar320 * 0.0 + fVar377 * -0.0;
  fVar213 = fVar305 * -0.0 + fVar232 + fVar335 * 0.0 + fVar378 * -0.0;
  fVar215 = fVar363 * -0.0 + fVar318 + fVar337 * 0.0 + fVar379 * -0.0;
  fVar228 = fVar368 * 0.0 + ((fVar280 * 0.5 + fVar348 * 0.0) - fVar319 * 0.5);
  fVar219 = fVar377 * 0.0 + ((fVar301 * 0.5 + fVar231 * 0.0) - fVar320 * 0.5);
  fVar280 = fVar378 * 0.0 + ((fVar305 * 0.5 + fVar232 * 0.0) - fVar335 * 0.5);
  fVar378 = fVar379 * 0.0 + ((fVar363 * 0.5 + fVar318 * 0.0) - fVar337 * 0.5);
  fVar319 = fVar256 * fVar218 - fVar229 * fVar233;
  fVar320 = fVar258 * fVar229 - fVar187 * fVar256;
  fVar335 = fVar233 * fVar187 - fVar218 * fVar258;
  fVar337 = fVar260 * fVar230 - fVar230 * fVar260;
  fVar355 = fVar256 * fVar341 - fVar350 * fVar233;
  fVar187 = fVar258 * fVar350 - fVar352 * fVar256;
  fVar230 = fVar233 * fVar352 - fVar341 * fVar258;
  fVar229 = fVar273 * fVar365 - fVar116 * fVar261;
  fVar305 = fVar275 * fVar116 - fVar213 * fVar273;
  fVar348 = fVar261 * fVar213 - fVar365 * fVar275;
  fVar232 = fVar278 * fVar215 - fVar215 * fVar278;
  fVar218 = fVar273 * fVar228 - fVar219 * fVar261;
  fVar219 = fVar275 * fVar219 - fVar280 * fVar273;
  fVar228 = fVar261 * fVar280 - fVar228 * fVar275;
  fVar215 = fVar335 * fVar335 + fVar320 * fVar320 + fVar319 * fVar319;
  auVar235 = ZEXT416((uint)fVar215);
  auVar191 = rsqrtss(ZEXT416((uint)fVar215),auVar235);
  fVar365 = auVar191._0_4_;
  fVar280 = fVar365 * 1.5 - fVar365 * fVar365 * fVar215 * 0.5 * fVar365;
  fVar365 = fVar319 * fVar355 + fVar335 * fVar230 + fVar320 * fVar187;
  auVar191 = rcpss(auVar235,auVar235);
  fVar116 = (2.0 - fVar215 * auVar191._0_4_) * auVar191._0_4_;
  fVar213 = fVar337 * fVar280;
  fVar379 = fVar348 * fVar348 + fVar305 * fVar305 + fVar229 * fVar229;
  auVar191 = ZEXT416((uint)fVar379);
  auVar235 = rsqrtss(ZEXT416((uint)fVar379),auVar191);
  fVar301 = auVar235._0_4_;
  fVar350 = fVar301 * 1.5 - fVar301 * fVar301 * fVar379 * 0.5 * fVar301;
  fVar352 = fVar229 * fVar218 + fVar348 * fVar228 + fVar305 * fVar219;
  auVar191 = rcpss(auVar191,auVar191);
  fVar369 = (2.0 - fVar379 * auVar191._0_4_) * auVar191._0_4_;
  fVar341 = fVar232 * fVar350;
  fVar301 = fVar391 * fVar320 * fVar280;
  fVar363 = fVar391 * fVar335 * fVar280;
  fVar231 = fVar391 * fVar319 * fVar280;
  fVar318 = fVar391 * fVar213;
  fVar187 = fVar391 * fVar116 * (fVar215 * fVar187 - fVar365 * fVar320) * fVar280 +
            fVar260 * fVar320 * fVar280;
  fVar230 = fVar391 * fVar116 * (fVar215 * fVar230 - fVar365 * fVar335) * fVar280 +
            fVar260 * fVar335 * fVar280;
  fVar355 = fVar391 * fVar116 * (fVar215 * fVar355 - fVar365 * fVar319) * fVar280 +
            fVar260 * fVar319 * fVar280;
  fVar280 = fVar391 * fVar116 * (fVar215 * (fVar260 * fVar354 - fVar354 * fVar260) -
                                fVar365 * fVar337) * fVar280 + fVar260 * fVar213;
  fVar319 = fVar394 - fVar301;
  fVar320 = fVar366 - fVar363;
  fVar335 = fVar380 - fVar231;
  fVar337 = fVar391 - fVar318;
  fVar301 = fVar301 + fVar394;
  fVar363 = fVar363 + fVar366;
  fVar231 = fVar231 + fVar380;
  fVar318 = fVar318 + fVar391;
  fVar365 = fVar277 * fVar305 * fVar350;
  fVar116 = fVar277 * fVar348 * fVar350;
  fVar213 = fVar277 * fVar229 * fVar350;
  fVar215 = fVar277 * fVar341;
  fVar305 = fVar277 * fVar369 * (fVar379 * fVar219 - fVar352 * fVar305) * fVar350 +
            fVar278 * fVar305 * fVar350;
  fVar368 = fVar277 * fVar369 * (fVar379 * fVar228 - fVar352 * fVar348) * fVar350 +
            fVar278 * fVar348 * fVar350;
  fVar377 = fVar277 * fVar369 * (fVar379 * fVar218 - fVar352 * fVar229) * fVar350 +
            fVar278 * fVar229 * fVar350;
  fVar232 = fVar277 * fVar369 * (fVar379 * (fVar278 * fVar378 - fVar378 * fVar278) -
                                fVar352 * fVar232) * fVar350 + fVar278 * fVar341;
  fVar218 = fVar262 - fVar365;
  fVar219 = fVar274 - fVar116;
  fVar228 = fVar276 - fVar213;
  fVar229 = fVar277 - fVar215;
  fVar365 = fVar365 + fVar262;
  fVar116 = fVar116 + fVar274;
  fVar213 = fVar213 + fVar276;
  fVar215 = fVar215 + fVar277;
  fVar348 = 1.0 - fVar144;
  local_378 = fVar340 * fVar348 + fVar319 * fVar144;
  fStack_374 = fVar349 * fVar348 + fVar320 * fVar144;
  fStack_370 = fVar351 * fVar348 + fVar335 * fVar144;
  fStack_36c = fVar353 * fVar348 + fVar337 * fVar144;
  local_388 = ((fVar410 - fVar321) * 0.33333334 + fVar340) * fVar348 +
              ((fVar233 - fVar187) * 0.33333334 + fVar319) * fVar144;
  fStack_384 = ((fVar411 - fVar336) * 0.33333334 + fVar349) * fVar348 +
               ((fVar256 - fVar230) * 0.33333334 + fVar320) * fVar144;
  fStack_380 = ((fVar216 - fVar338) * 0.33333334 + fVar351) * fVar348 +
               ((fVar258 - fVar355) * 0.33333334 + fVar335) * fVar144;
  fStack_37c = ((fVar217 - fVar339) * 0.33333334 + fVar353) * fVar348 +
               ((fVar260 - fVar280) * 0.33333334 + fVar337) * fVar144;
  local_3a8 = (fVar393 - (fVar401 - fVar356) * 0.33333334) * fVar348 +
              (fVar218 - (fVar261 - fVar305) * 0.33333334) * fVar144;
  fStack_3a4 = (fVar255 - (fVar402 - fVar364) * 0.33333334) * fVar348 +
               (fVar219 - (fVar273 - fVar368) * 0.33333334) * fVar144;
  fStack_3a0 = (fVar257 - (fVar403 - fVar367) * 0.33333334) * fVar348 +
               (fVar228 - (fVar275 - fVar377) * 0.33333334) * fVar144;
  fStack_39c = (fVar259 - (fVar409 - fVar389) * 0.33333334) * fVar348 +
               (fVar229 - (fVar278 - fVar232) * 0.33333334) * fVar144;
  local_398 = fVar393 * fVar348 + fVar218 * fVar144;
  fStack_394 = fVar255 * fVar348 + fVar219 * fVar144;
  fStack_390 = fVar257 * fVar348 + fVar228 * fVar144;
  fStack_38c = fVar259 * fVar348 + fVar229 * fVar144;
  local_368 = fVar281 * fVar348 + fVar301 * fVar144;
  fStack_364 = fVar302 * fVar348 + fVar363 * fVar144;
  fStack_360 = fVar303 * fVar348 + fVar231 * fVar144;
  fStack_35c = fVar304 * fVar348 + fVar318 * fVar144;
  local_358 = ((fVar321 + fVar410) * 0.33333334 + fVar281) * fVar348 +
              ((fVar187 + fVar233) * 0.33333334 + fVar301) * fVar144;
  fStack_354 = ((fVar336 + fVar411) * 0.33333334 + fVar302) * fVar348 +
               ((fVar230 + fVar256) * 0.33333334 + fVar363) * fVar144;
  fStack_350 = ((fVar338 + fVar216) * 0.33333334 + fVar303) * fVar348 +
               ((fVar355 + fVar258) * 0.33333334 + fVar231) * fVar144;
  fStack_34c = ((fVar339 + fVar217) * 0.33333334 + fVar304) * fVar348 +
               ((fVar280 + fVar260) * 0.33333334 + fVar318) * fVar144;
  local_3b8 = (fVar388 - (fVar356 + fVar401) * 0.33333334) * fVar348 +
              (fVar365 - (fVar305 + fVar261) * 0.33333334) * fVar144;
  fStack_3b4 = (fVar390 - (fVar364 + fVar402) * 0.33333334) * fVar348 +
               (fVar116 - (fVar368 + fVar273) * 0.33333334) * fVar144;
  fStack_3b0 = (fVar392 - (fVar367 + fVar403) * 0.33333334) * fVar348 +
               (fVar213 - (fVar377 + fVar275) * 0.33333334) * fVar144;
  fStack_3ac = (fVar400 - (fVar389 + fVar409) * 0.33333334) * fVar348 +
               (fVar215 - (fVar232 + fVar278) * 0.33333334) * fVar144;
  local_218 = fVar348 * fVar388 + fVar144 * fVar365;
  fStack_214 = fVar348 * fVar390 + fVar144 * fVar116;
  fStack_210 = fVar348 * fVar392 + fVar144 * fVar213;
  fStack_20c = fVar348 * fVar400 + fVar144 * fVar215;
  fVar365 = (ray->org).field_0.m128[0];
  fVar116 = (ray->org).field_0.m128[1];
  fVar144 = (ray->org).field_0.m128[2];
  fVar213 = (pre->ray_space).vx.field_0.m128[0];
  fVar215 = (pre->ray_space).vx.field_0.m128[1];
  fVar218 = (pre->ray_space).vy.field_0.m128[0];
  fVar219 = (pre->ray_space).vy.field_0.m128[1];
  fVar228 = (pre->ray_space).vz.field_0.m128[0];
  fVar229 = (pre->ray_space).vz.field_0.m128[1];
  fVar280 = (local_378 - fVar365) * fVar213 +
            (fStack_374 - fVar116) * fVar218 + (fStack_370 - fVar144) * fVar228;
  fVar301 = (local_378 - fVar365) * fVar215 +
            (fStack_374 - fVar116) * fVar219 + (fStack_370 - fVar144) * fVar229;
  local_308._0_8_ = CONCAT44(fVar301,fVar280);
  fVar275 = (local_388 - fVar365) * fVar213 +
            (fStack_384 - fVar116) * fVar218 + (fStack_380 - fVar144) * fVar228;
  fVar355 = (local_388 - fVar365) * fVar215 +
            (fStack_384 - fVar116) * fVar219 + (fStack_380 - fVar144) * fVar229;
  local_318._0_8_ = CONCAT44(fVar355,fVar275);
  fVar187 = (local_3a8 - fVar365) * fVar213 +
            (fStack_3a4 - fVar116) * fVar218 + (fStack_3a0 - fVar144) * fVar228;
  fVar230 = (local_3a8 - fVar365) * fVar215 +
            (fStack_3a4 - fVar116) * fVar219 + (fStack_3a0 - fVar144) * fVar229;
  local_348 = CONCAT44(fVar230,fVar187);
  fVar261 = (local_398 - fVar365) * fVar213 +
            (fStack_394 - fVar116) * fVar218 + (fStack_390 - fVar144) * fVar228;
  fVar273 = (local_398 - fVar365) * fVar215 +
            (fStack_394 - fVar116) * fVar219 + (fStack_390 - fVar144) * fVar229;
  local_2c8 = CONCAT44(fVar273,fVar261);
  local_328 = (local_368 - fVar365) * fVar213 +
              (fStack_364 - fVar116) * fVar218 + (fStack_360 - fVar144) * fVar228;
  fStack_324 = (local_368 - fVar365) * fVar215 +
               (fStack_364 - fVar116) * fVar219 + (fStack_360 - fVar144) * fVar229;
  fVar305 = (local_358 - fVar365) * fVar213 +
            (fStack_354 - fVar116) * fVar218 + (fStack_350 - fVar144) * fVar228;
  fVar363 = (local_358 - fVar365) * fVar215 +
            (fStack_354 - fVar116) * fVar219 + (fStack_350 - fVar144) * fVar229;
  local_2d8 = CONCAT44(fVar363,fVar305);
  local_2e8 = (local_3b8 - fVar365) * fVar213 +
              (fStack_3b4 - fVar116) * fVar218 + (fStack_3b0 - fVar144) * fVar228;
  fStack_2e4 = (local_3b8 - fVar365) * fVar215 +
               (fStack_3b4 - fVar116) * fVar219 + (fStack_3b0 - fVar144) * fVar229;
  fVar213 = (local_218 - fVar365) * fVar213 +
            (fStack_214 - fVar116) * fVar218 + (fStack_210 - fVar144) * fVar228;
  fVar365 = (local_218 - fVar365) * fVar215 +
            (fStack_214 - fVar116) * fVar219 + (fStack_210 - fVar144) * fVar229;
  local_2f8 = CONCAT44(fVar365,fVar213);
  auVar358._8_8_ = local_2d8;
  auVar358._0_8_ = local_318._0_8_;
  local_b8._8_8_ = local_2f8;
  local_b8._0_8_ = local_2c8;
  auVar129._8_4_ = local_328;
  auVar129._0_8_ = local_308._0_8_;
  auVar129._12_4_ = fStack_324;
  auVar191 = minps(auVar129,auVar358);
  auVar168._8_4_ = local_2e8;
  auVar168._0_8_ = local_348;
  auVar168._12_4_ = fStack_2e4;
  auVar235 = minps(auVar168,local_b8);
  auVar191 = minps(auVar191,auVar235);
  auVar169._4_4_ = fVar301;
  auVar169._0_4_ = fVar280;
  auVar169._8_4_ = local_328;
  auVar169._12_4_ = fStack_324;
  auVar235 = maxps(auVar169,auVar358);
  auVar202._4_4_ = fVar230;
  auVar202._0_4_ = fVar187;
  auVar202._8_4_ = local_2e8;
  auVar202._12_4_ = fStack_2e4;
  auVar203 = maxps(auVar202,local_b8);
  auVar170 = maxps(auVar235,auVar203);
  auVar28._4_8_ = auVar203._8_8_;
  auVar28._0_4_ = auVar191._4_4_;
  auVar204._0_8_ = auVar28._0_8_ << 0x20;
  auVar204._8_4_ = auVar191._8_4_;
  auVar204._12_4_ = auVar191._12_4_;
  auVar205._8_8_ = auVar191._8_8_;
  auVar205._0_8_ = auVar204._8_8_;
  auVar235 = minps(auVar191,auVar205);
  auVar29._4_8_ = auVar191._8_8_;
  auVar29._0_4_ = auVar170._4_4_;
  auVar206._0_8_ = auVar29._0_8_ << 0x20;
  auVar206._8_4_ = auVar170._8_4_;
  auVar206._12_4_ = auVar170._12_4_;
  auVar207._8_8_ = auVar170._8_8_;
  auVar207._0_8_ = auVar206._8_8_;
  auVar191 = maxps(auVar170,auVar207);
  auVar130._0_8_ = auVar235._0_8_ & 0x7fffffff7fffffff;
  auVar130._8_4_ = auVar235._8_4_ & 0x7fffffff;
  auVar130._12_4_ = auVar235._12_4_ & 0x7fffffff;
  auVar171._0_8_ = auVar191._0_8_ & 0x7fffffff7fffffff;
  auVar171._8_4_ = auVar191._8_4_ & 0x7fffffff;
  auVar171._12_4_ = auVar191._12_4_ & 0x7fffffff;
  auVar191 = maxps(auVar130,auVar171);
  fStack_c4 = auVar191._4_4_;
  local_c8 = fStack_c4;
  if (fStack_c4 <= auVar191._0_4_) {
    local_c8 = auVar191._0_4_;
  }
  local_c8 = local_c8 * 9.536743e-07;
  local_308._8_8_ = local_308._0_8_;
  local_318._8_8_ = local_318._0_8_;
  register0x00001388 = local_2c8;
  register0x00001548 = local_2d8;
  register0x00001348 = local_2f8;
  fStack_c0 = fStack_c4;
  fStack_bc = fStack_c4;
  local_88 = fVar275 - fVar280;
  fStack_84 = fVar355 - fVar301;
  fStack_80 = fVar305 - local_328;
  fStack_7c = fVar363 - fStack_324;
  local_98 = fVar187 - fVar275;
  fStack_94 = fVar230 - fVar355;
  fStack_90 = local_2e8 - fVar305;
  fStack_8c = fStack_2e4 - fVar363;
  fStack_2a4 = fStack_2e4;
  local_2a8 = local_2e8;
  uStack_2a0 = local_2d8;
  local_a8 = fVar261 - fVar187;
  fStack_a4 = fVar273 - fVar230;
  fStack_a0 = fVar213 - local_2e8;
  fStack_9c = fVar365 - fStack_2e4;
  local_198 = local_368 - local_378;
  fStack_194 = fStack_364 - fStack_374;
  fStack_190 = fStack_360 - fStack_370;
  fStack_18c = fStack_35c - fStack_36c;
  local_1a8 = local_358 - local_388;
  fStack_1a4 = fStack_354 - fStack_384;
  fStack_1a0 = fStack_350 - fStack_380;
  fStack_19c = fStack_34c - fStack_37c;
  local_1b8 = local_3b8 - local_3a8;
  fStack_1b4 = fStack_3b4 - fStack_3a4;
  fStack_1b0 = fStack_3b0 - fStack_3a0;
  fStack_1ac = fStack_3ac - fStack_39c;
  local_1c8 = local_218 - local_398;
  fStack_1c4 = fStack_214 - fStack_394;
  fStack_1c0 = fStack_210 - fStack_390;
  fStack_1bc = fStack_20c - fStack_38c;
  bVar110 = 0;
  uVar106 = 0;
  local_408._0_4_ = 0.0;
  local_408._4_4_ = 1.0;
  fStack_400 = 0.0;
  fStack_3fc = 0.0;
  fVar144 = 0.0;
  fVar213 = 1.0;
  local_158 = local_c8;
  fStack_154 = local_c8;
  fStack_150 = local_c8;
  fStack_14c = local_c8;
  local_168 = -local_c8;
  fStack_164 = -local_c8;
  fStack_160 = -local_c8;
  fStack_15c = -local_c8;
  fVar365 = fVar187;
  fVar116 = fVar230;
  uStack_340 = local_348;
  fStack_320 = local_328;
  fStack_31c = fStack_324;
  fStack_2e0 = local_2e8;
  fStack_2dc = fStack_2e4;
  local_2b8 = local_348;
  local_298 = (ulong)uVar113;
LAB_003d055a:
  fVar215 = 1.0 - (float)local_408._0_4_;
  fVar218 = 1.0 - (float)local_408._0_4_;
  fVar219 = 1.0 - (float)local_408._4_4_;
  fVar228 = 1.0 - (float)local_408._4_4_;
  fVar305 = local_308._0_4_ * fVar215 + local_328 * (float)local_408._0_4_;
  fVar319 = local_308._4_4_ * fVar218 + fStack_324 * (float)local_408._0_4_;
  fVar320 = local_308._8_4_ * fVar219 + fStack_320 * (float)local_408._4_4_;
  fVar368 = local_308._12_4_ * fVar228 + fStack_31c * (float)local_408._4_4_;
  fVar229 = local_318._0_4_ * fVar215 + local_2d8._0_4_ * (float)local_408._0_4_;
  fVar231 = local_318._4_4_ * fVar218 + local_2d8._4_4_ * (float)local_408._0_4_;
  fVar232 = local_318._8_4_ * fVar219 + local_2d8._8_4_ * (float)local_408._4_4_;
  fVar318 = local_318._12_4_ * fVar228 + local_2d8._12_4_ * (float)local_408._4_4_;
  fVar394 = fVar187 * fVar215 + local_2e8 * (float)local_408._0_4_;
  fVar400 = fVar230 * fVar218 + fStack_2e4 * (float)local_408._0_4_;
  fVar401 = fVar365 * fVar219 + fStack_2e0 * (float)local_408._4_4_;
  fVar402 = fVar116 * fVar228 + fStack_2dc * (float)local_408._4_4_;
  fVar335 = fVar215 * local_2c8._0_4_ + (float)local_408._0_4_ * local_2f8._0_4_;
  fVar337 = fVar218 * local_2c8._4_4_ + (float)local_408._0_4_ * local_2f8._4_4_;
  fVar377 = fVar219 * local_2c8._8_4_ + (float)local_408._4_4_ * local_2f8._8_4_;
  fVar378 = fVar228 * local_2c8._12_4_ + (float)local_408._4_4_ * local_2f8._12_4_;
  fVar379 = (fVar213 - fVar144) * 0.11111111;
  local_418 = CONCAT44(fVar213,fVar144);
  fVar388 = (fVar213 - fVar144) * 0.0 + fVar144;
  fVar390 = (fVar213 - fVar144) * 0.33333334 + fVar144;
  fVar392 = (fVar213 - fVar144) * 0.6666667 + fVar144;
  fVar144 = (fVar213 - fVar144) * 1.0 + fVar144;
  fVar365 = 1.0 - fVar388;
  fVar116 = 1.0 - fVar390;
  fVar213 = 1.0 - fVar392;
  fVar228 = 1.0 - fVar144;
  fVar187 = fVar229 * fVar365 + fVar394 * fVar388;
  fVar230 = fVar229 * fVar116 + fVar394 * fVar390;
  fVar261 = fVar229 * fVar213 + fVar394 * fVar392;
  fVar273 = fVar229 * fVar228 + fVar394 * fVar144;
  fVar275 = fVar231 * fVar365 + fVar400 * fVar388;
  fVar355 = fVar231 * fVar116 + fVar400 * fVar390;
  fVar280 = fVar231 * fVar213 + fVar400 * fVar392;
  fVar301 = fVar231 * fVar228 + fVar400 * fVar144;
  fVar215 = (fVar305 * fVar365 + fVar229 * fVar388) * fVar365 + fVar388 * fVar187;
  fVar218 = (fVar305 * fVar116 + fVar229 * fVar390) * fVar116 + fVar390 * fVar230;
  fVar219 = (fVar305 * fVar213 + fVar229 * fVar392) * fVar213 + fVar392 * fVar261;
  fVar229 = (fVar305 * fVar228 + fVar229 * fVar144) * fVar228 + fVar144 * fVar273;
  fVar305 = (fVar319 * fVar365 + fVar231 * fVar388) * fVar365 + fVar388 * fVar275;
  fVar363 = (fVar319 * fVar116 + fVar231 * fVar390) * fVar116 + fVar390 * fVar355;
  fVar348 = (fVar319 * fVar213 + fVar231 * fVar392) * fVar213 + fVar392 * fVar280;
  fVar231 = (fVar319 * fVar228 + fVar231 * fVar144) * fVar228 + fVar144 * fVar301;
  fVar187 = fVar187 * fVar365 + (fVar394 * fVar365 + fVar335 * fVar388) * fVar388;
  fVar230 = fVar230 * fVar116 + (fVar394 * fVar116 + fVar335 * fVar390) * fVar390;
  fVar261 = fVar261 * fVar213 + (fVar394 * fVar213 + fVar335 * fVar392) * fVar392;
  fVar273 = fVar273 * fVar228 + (fVar394 * fVar228 + fVar335 * fVar144) * fVar144;
  fVar275 = fVar275 * fVar365 + (fVar400 * fVar365 + fVar337 * fVar388) * fVar388;
  fVar355 = fVar355 * fVar116 + (fVar400 * fVar116 + fVar337 * fVar390) * fVar390;
  fVar280 = fVar280 * fVar213 + (fVar400 * fVar213 + fVar337 * fVar392) * fVar392;
  fVar301 = fVar301 * fVar228 + (fVar400 * fVar228 + fVar337 * fVar144) * fVar144;
  local_258 = fVar365 * fVar215 + fVar388 * fVar187;
  fStack_254 = fVar116 * fVar218 + fVar390 * fVar230;
  fStack_250 = fVar213 * fVar219 + fVar392 * fVar261;
  fStack_24c = fVar228 * fVar229 + fVar144 * fVar273;
  local_148 = fVar365 * fVar305 + fVar388 * fVar275;
  fStack_144 = fVar116 * fVar363 + fVar390 * fVar355;
  fStack_140 = fVar213 * fVar348 + fVar392 * fVar280;
  fStack_13c = fVar228 * fVar231 + fVar144 * fVar301;
  fVar218 = (fVar230 - fVar218) * 3.0 * fVar379;
  fVar219 = (fVar261 - fVar219) * 3.0 * fVar379;
  fVar229 = (fVar273 - fVar229) * 3.0 * fVar379;
  fVar230 = (fVar355 - fVar363) * 3.0 * fVar379;
  fVar261 = (fVar280 - fVar348) * 3.0 * fVar379;
  fVar273 = (fVar301 - fVar231) * 3.0 * fVar379;
  local_228._4_4_ = fStack_250;
  local_228._0_4_ = fStack_254;
  local_228._8_4_ = fStack_24c;
  local_228._12_4_ = 0;
  local_e8._4_4_ = fStack_140;
  local_e8._0_4_ = fStack_144;
  local_238 = local_258 + (fVar187 - fVar215) * 3.0 * fVar379;
  fStack_234 = fStack_254 + fVar218;
  fStack_230 = fStack_250 + fVar219;
  fStack_22c = fStack_24c + fVar229;
  local_338._0_4_ = local_148 + (fVar275 - fVar305) * 3.0 * fVar379;
  local_338._4_4_ = fStack_144 + fVar230;
  fStack_330 = fStack_140 + fVar261;
  fStack_32c = fStack_13c + fVar273;
  local_248._0_4_ = fStack_254 - fVar218;
  local_248._4_4_ = fStack_250 - fVar219;
  local_248._8_4_ = fStack_24c - fVar229;
  local_248._12_4_ = 0;
  auVar131._0_4_ = fStack_144 - fVar230;
  auVar131._4_4_ = fStack_140 - fVar261;
  auVar131._8_4_ = fStack_13c - fVar273;
  auVar131._12_4_ = 0;
  fVar215 = fVar232 * fVar365 + fVar401 * fVar388;
  fVar218 = fVar232 * fVar116 + fVar401 * fVar390;
  fVar219 = fVar232 * fVar213 + fVar401 * fVar392;
  fVar229 = fVar232 * fVar228 + fVar401 * fVar144;
  fVar187 = fVar318 * fVar365 + fVar402 * fVar388;
  fVar230 = fVar318 * fVar116 + fVar402 * fVar390;
  fVar261 = fVar318 * fVar213 + fVar402 * fVar392;
  fVar319 = fVar318 * fVar228 + fVar402 * fVar144;
  fVar273 = (fVar320 * fVar365 + fVar232 * fVar388) * fVar365 + fVar388 * fVar215;
  fVar275 = (fVar320 * fVar116 + fVar232 * fVar390) * fVar116 + fVar390 * fVar218;
  fVar355 = (fVar320 * fVar213 + fVar232 * fVar392) * fVar213 + fVar392 * fVar219;
  fVar280 = (fVar320 * fVar228 + fVar232 * fVar144) * fVar228 + fVar144 * fVar229;
  fVar320 = (fVar368 * fVar365 + fVar318 * fVar388) * fVar365 + fVar388 * fVar187;
  fVar335 = (fVar368 * fVar116 + fVar318 * fVar390) * fVar116 + fVar390 * fVar230;
  fVar337 = (fVar368 * fVar213 + fVar318 * fVar392) * fVar213 + fVar392 * fVar261;
  fVar368 = (fVar368 * fVar228 + fVar318 * fVar144) * fVar228 + fVar144 * fVar319;
  fVar301 = fVar215 * fVar365 + (fVar401 * fVar365 + fVar377 * fVar388) * fVar388;
  fVar305 = fVar218 * fVar116 + (fVar401 * fVar116 + fVar377 * fVar390) * fVar390;
  fVar363 = fVar219 * fVar213 + (fVar401 * fVar213 + fVar377 * fVar392) * fVar392;
  fVar348 = fVar229 * fVar228 + (fVar401 * fVar228 + fVar377 * fVar144) * fVar144;
  fVar231 = fVar187 * fVar365 + (fVar402 * fVar365 + fVar378 * fVar388) * fVar388;
  fVar232 = fVar230 * fVar116 + (fVar402 * fVar116 + fVar378 * fVar390) * fVar390;
  fVar318 = fVar261 * fVar213 + (fVar402 * fVar213 + fVar378 * fVar392) * fVar392;
  fVar319 = fVar319 * fVar228 + (fVar402 * fVar228 + fVar378 * fVar144) * fVar144;
  fVar229 = fVar365 * fVar273 + fVar388 * fVar301;
  fVar187 = fVar116 * fVar275 + fVar390 * fVar305;
  fVar230 = fVar213 * fVar355 + fVar392 * fVar363;
  fVar261 = fVar228 * fVar280 + fVar144 * fVar348;
  fVar215 = fVar365 * fVar320 + fVar388 * fVar231;
  fVar218 = fVar116 * fVar335 + fVar390 * fVar232;
  fVar219 = fVar213 * fVar337 + fVar392 * fVar318;
  fVar228 = fVar228 * fVar368 + fVar144 * fVar319;
  fVar365 = (fVar305 - fVar275) * 3.0 * fVar379;
  fVar116 = (fVar363 - fVar355) * 3.0 * fVar379;
  fVar144 = (fVar348 - fVar280) * 3.0 * fVar379;
  fVar213 = (fVar232 - fVar335) * 3.0 * fVar379;
  fVar275 = (fVar318 - fVar337) * 3.0 * fVar379;
  fVar355 = (fVar319 - fVar368) * 3.0 * fVar379;
  local_f8._4_4_ = fVar230;
  local_f8._0_4_ = fVar187;
  local_f8._8_4_ = fVar261;
  local_f8._12_4_ = 0;
  local_118._4_4_ = fVar219;
  local_118._0_4_ = fVar218;
  local_118._8_4_ = fVar228;
  local_118._12_4_ = 0;
  local_138 = fVar229 + (fVar301 - fVar273) * 3.0 * fVar379;
  fStack_134 = fVar187 + fVar365;
  fStack_130 = fVar230 + fVar116;
  fStack_12c = fVar261 + fVar144;
  local_108 = fVar215 + (fVar231 - fVar320) * 3.0 * fVar379;
  fStack_104 = fVar218 + fVar213;
  fStack_100 = fVar219 + fVar275;
  fStack_fc = fVar228 + fVar355;
  local_d8._0_4_ = fVar187 - fVar365;
  local_d8._4_4_ = fVar230 - fVar116;
  local_d8._8_4_ = fVar261 - fVar144;
  local_d8._12_4_ = 0;
  local_128._0_4_ = fVar218 - fVar213;
  local_128._4_4_ = fVar219 - fVar275;
  local_128._8_4_ = fVar228 - fVar355;
  local_128._12_4_ = 0;
  fVar365 = (fVar187 - fStack_254) + (fVar229 - local_258);
  fVar116 = (fVar230 - fStack_250) + (fVar187 - fStack_254);
  fVar144 = (fVar261 - fStack_24c) + (fVar230 - fStack_250);
  fVar213 = (fVar261 - fStack_24c) + 0.0;
  local_e8._8_4_ = fStack_13c;
  local_e8._12_4_ = 0;
  fVar273 = (fVar218 - fStack_144) + (fVar215 - local_148);
  fVar275 = (fVar219 - fStack_140) + (fVar218 - fStack_144);
  fVar355 = (fVar228 - fStack_13c) + (fVar219 - fStack_140);
  fVar280 = (fVar228 - fStack_13c) + 0.0;
  auVar294._0_8_ =
       CONCAT44(fStack_144 * fVar116 - fStack_254 * fVar275,
                local_148 * fVar365 - local_258 * fVar273);
  auVar294._8_4_ = fStack_140 * fVar144 - fStack_250 * fVar355;
  auVar294._12_4_ = fStack_13c * fVar213 - fStack_24c * fVar280;
  auVar245._0_4_ = (float)local_338._0_4_ * fVar365 - local_238 * fVar273;
  auVar245._4_4_ = (float)local_338._4_4_ * fVar116 - fStack_234 * fVar275;
  auVar245._8_4_ = fStack_330 * fVar144 - fStack_230 * fVar355;
  auVar245._12_4_ = fStack_32c * fVar213 - fStack_22c * fVar280;
  auVar264._0_8_ =
       CONCAT44(auVar131._4_4_ * fVar116 - fVar275 * local_248._4_4_,
                auVar131._0_4_ * fVar365 - fVar273 * local_248._0_4_);
  auVar264._8_4_ = auVar131._8_4_ * fVar144 - fVar355 * local_248._8_4_;
  auVar264._12_4_ = fVar213 * 0.0 - fVar280 * 0.0;
  auVar374._0_4_ = fVar365 * fStack_144 - fVar273 * fStack_254;
  auVar374._4_4_ = fVar116 * fStack_140 - fVar275 * fStack_250;
  auVar374._8_4_ = fVar144 * fStack_13c - fVar355 * fStack_24c;
  auVar374._12_4_ = fVar213 * 0.0 - fVar280 * 0.0;
  auVar328._0_8_ =
       CONCAT44(fVar218 * fVar116 - fVar187 * fVar275,fVar215 * fVar365 - fVar229 * fVar273);
  auVar328._8_4_ = fVar219 * fVar144 - fVar230 * fVar355;
  auVar328._12_4_ = fVar228 * fVar213 - fVar261 * fVar280;
  auVar384._0_4_ = local_108 * fVar365 - local_138 * fVar273;
  auVar384._4_4_ = fStack_104 * fVar116 - fStack_134 * fVar275;
  auVar384._8_4_ = fStack_100 * fVar144 - fStack_130 * fVar355;
  auVar384._12_4_ = fStack_fc * fVar213 - fStack_12c * fVar280;
  auVar309._0_8_ =
       CONCAT44(local_128._4_4_ * fVar116 - fVar275 * local_d8._4_4_,
                local_128._0_4_ * fVar365 - fVar273 * local_d8._0_4_);
  auVar309._8_4_ = local_128._8_4_ * fVar144 - fVar355 * local_d8._8_4_;
  auVar309._12_4_ = fVar213 * 0.0 - fVar280 * 0.0;
  auVar134._0_4_ = fVar365 * fVar218 - fVar273 * fVar187;
  auVar134._4_4_ = fVar116 * fVar219 - fVar275 * fVar230;
  auVar134._8_4_ = fVar144 * fVar228 - fVar355 * fVar261;
  auVar134._12_4_ = fVar213 * 0.0 - fVar280 * 0.0;
  auVar172._8_4_ = auVar294._8_4_;
  auVar172._0_8_ = auVar294._0_8_;
  auVar172._12_4_ = auVar294._12_4_;
  auVar191 = minps(auVar172,auVar245);
  auVar170 = maxps(auVar294,auVar245);
  auVar246._8_4_ = auVar264._8_4_;
  auVar246._0_8_ = auVar264._0_8_;
  auVar246._12_4_ = auVar264._12_4_;
  auVar235 = minps(auVar246,auVar374);
  auVar191 = minps(auVar191,auVar235);
  auVar235 = maxps(auVar264,auVar374);
  auVar203 = maxps(auVar170,auVar235);
  auVar247._8_4_ = auVar328._8_4_;
  auVar247._0_8_ = auVar328._0_8_;
  auVar247._12_4_ = auVar328._12_4_;
  auVar235 = minps(auVar247,auVar384);
  auVar329 = maxps(auVar328,auVar384);
  auVar265._8_4_ = auVar309._8_4_;
  auVar265._0_8_ = auVar309._0_8_;
  auVar265._12_4_ = auVar309._12_4_;
  auVar170 = minps(auVar265,auVar134);
  auVar235 = minps(auVar235,auVar170);
  auVar191 = minps(auVar191,auVar235);
  auVar235 = maxps(auVar309,auVar134);
  auVar235 = maxps(auVar329,auVar235);
  auVar235 = maxps(auVar203,auVar235);
  bVar111 = auVar191._4_4_ <= fStack_154;
  bVar26 = auVar191._8_4_ <= fStack_150;
  bVar27 = auVar191._12_4_ <= fStack_14c;
  auVar91._4_4_ = -(uint)bVar26;
  auVar91._0_4_ = -(uint)bVar111;
  auVar91._8_4_ = -(uint)bVar27;
  auVar91._12_4_ = 0;
  auVar176 = auVar91 << 0x20;
  auVar295._0_4_ =
       -(uint)(local_168 <= auVar235._0_4_ && auVar191._0_4_ <= local_158) & local_178._0_4_;
  auVar295._4_4_ = -(uint)(fStack_164 <= auVar235._4_4_ && bVar111) & local_178._4_4_;
  auVar295._8_4_ = -(uint)(fStack_160 <= auVar235._8_4_ && bVar26) & local_178._8_4_;
  auVar295._12_4_ = -(uint)(fStack_15c <= auVar235._12_4_ && bVar27) & local_178._12_4_;
  uVar113 = movmskps((int)uVar103,auVar295);
  uVar103 = (ulong)uVar113;
  if (uVar113 != 0) {
    fVar365 = (fVar187 - fVar229) + (fStack_254 - local_258);
    fVar116 = (fVar230 - fVar187) + (fStack_250 - fStack_254);
    fVar144 = (fVar261 - fVar230) + (fStack_24c - fStack_250);
    fVar213 = (0.0 - fVar261) + (0.0 - fStack_24c);
    fVar273 = (fVar218 - fVar215) + (fStack_144 - local_148);
    fVar275 = (fVar219 - fVar218) + (fStack_140 - fStack_144);
    fVar355 = (fVar228 - fVar219) + (fStack_13c - fStack_140);
    fVar280 = (0.0 - fVar228) + (0.0 - fStack_13c);
    auVar397._0_8_ =
         CONCAT44(fStack_144 * fVar116 - fStack_254 * fVar275,
                  local_148 * fVar365 - local_258 * fVar273);
    auVar397._8_4_ = fStack_140 * fVar144 - fStack_250 * fVar355;
    auVar397._12_4_ = fStack_13c * fVar213 - fStack_24c * fVar280;
    auVar248._0_4_ = (float)local_338._0_4_ * fVar365 - local_238 * fVar273;
    auVar248._4_4_ = (float)local_338._4_4_ * fVar116 - fStack_234 * fVar275;
    auVar248._8_4_ = fStack_330 * fVar144 - fStack_230 * fVar355;
    auVar248._12_4_ = fStack_32c * fVar213 - fStack_22c * fVar280;
    auVar310._0_8_ =
         CONCAT44(auVar131._4_4_ * fVar116 - local_248._4_4_ * fVar275,
                  auVar131._0_4_ * fVar365 - local_248._0_4_ * fVar273);
    auVar310._8_4_ = auVar131._8_4_ * fVar144 - local_248._8_4_ * fVar355;
    auVar310._12_4_ = fVar213 * 0.0 - fVar280 * 0.0;
    auVar266._0_4_ = fStack_144 * fVar365 - fStack_254 * fVar273;
    auVar266._4_4_ = fStack_140 * fVar116 - fStack_250 * fVar275;
    auVar266._8_4_ = fStack_13c * fVar144 - fStack_24c * fVar355;
    auVar266._12_4_ = fVar213 * 0.0 - fVar280 * 0.0;
    auVar208._0_8_ =
         CONCAT44(fVar218 * fVar116 - fVar187 * fVar275,fVar215 * fVar365 - fVar229 * fVar273);
    auVar208._8_4_ = fVar219 * fVar144 - fVar230 * fVar355;
    auVar208._12_4_ = fVar228 * fVar213 - fVar261 * fVar280;
    auVar343._0_4_ = local_108 * fVar365 - local_138 * fVar273;
    auVar343._4_4_ = fStack_104 * fVar116 - fStack_134 * fVar275;
    auVar343._8_4_ = fStack_100 * fVar144 - fStack_130 * fVar355;
    auVar343._12_4_ = fStack_fc * fVar213 - fStack_12c * fVar280;
    auVar375._0_8_ =
         CONCAT44(local_128._4_4_ * fVar116 - local_d8._4_4_ * fVar275,
                  local_128._0_4_ * fVar365 - local_d8._0_4_ * fVar273);
    auVar375._8_4_ = local_128._8_4_ * fVar144 - local_d8._8_4_ * fVar355;
    auVar375._12_4_ = fVar213 * 0.0 - fVar280 * 0.0;
    auVar134._0_4_ = fVar365 * fVar218 - fVar273 * fVar187;
    auVar134._4_4_ = fVar116 * fVar219 - fVar275 * fVar230;
    auVar134._8_4_ = fVar144 * fVar228 - fVar355 * fVar261;
    auVar134._12_4_ = fVar213 * 0.0 - fVar280 * 0.0;
    auVar173._8_4_ = auVar397._8_4_;
    auVar173._0_8_ = auVar397._0_8_;
    auVar173._12_4_ = auVar397._12_4_;
    auVar191 = minps(auVar173,auVar248);
    auVar170 = maxps(auVar397,auVar248);
    auVar249._8_4_ = auVar310._8_4_;
    auVar249._0_8_ = auVar310._0_8_;
    auVar249._12_4_ = auVar310._12_4_;
    auVar235 = minps(auVar249,auVar266);
    auVar191 = minps(auVar191,auVar235);
    auVar235 = maxps(auVar310,auVar266);
    auVar329 = maxps(auVar170,auVar235);
    auVar250._8_4_ = auVar208._8_4_;
    auVar250._0_8_ = auVar208._0_8_;
    auVar250._12_4_ = auVar208._12_4_;
    auVar170 = minps(auVar250,auVar343);
    auVar235 = maxps(auVar208,auVar343);
    auVar267._8_4_ = auVar375._8_4_;
    auVar267._0_8_ = auVar375._0_8_;
    auVar267._12_4_ = auVar375._12_4_;
    auVar203 = minps(auVar267,auVar134);
    auVar170 = minps(auVar170,auVar203);
    auVar191 = minps(auVar191,auVar170);
    auVar170 = maxps(auVar375,auVar134);
    auVar235 = maxps(auVar235,auVar170);
    auVar235 = maxps(auVar329,auVar235);
    bVar111 = auVar191._4_4_ <= fStack_154;
    bVar26 = auVar191._8_4_ <= fStack_150;
    bVar27 = auVar191._12_4_ <= fStack_14c;
    auVar92._4_4_ = -(uint)bVar26;
    auVar92._0_4_ = -(uint)bVar111;
    auVar92._8_4_ = -(uint)bVar27;
    auVar92._12_4_ = 0;
    auVar176 = auVar92 << 0x20;
    auVar398._0_4_ =
         -(uint)(local_168 <= auVar235._0_4_ && auVar191._0_4_ <= local_158) & auVar295._0_4_;
    auVar398._4_4_ = -(uint)(fStack_164 <= auVar235._4_4_ && bVar111) & auVar295._4_4_;
    auVar398._8_4_ = -(uint)(fStack_160 <= auVar235._8_4_ && bVar26) & auVar295._8_4_;
    auVar398._12_4_ = -(uint)(fStack_15c <= auVar235._12_4_ && bVar27) & auVar295._12_4_;
    uVar113 = movmskps(uVar113,auVar398);
    uVar103 = (ulong)uVar113;
    auVar384 = local_118;
    if (uVar113 != 0) {
      uVar103 = (ulong)(byte)uVar113;
      auStack_208[uVar106] = uVar113 & 0xff;
      *(undefined8 *)(afStack_78 + uVar106 * 2) = local_418;
      *(undefined1 (*) [8])(afStack_58 + uVar106 * 2) = local_408;
      uVar106 = (ulong)((int)uVar106 + 1);
      auVar134 = _local_408;
    }
  }
LAB_003d0bbf:
  _local_3f8 = auVar131;
  auVar191 = _local_3f8;
  if ((int)uVar106 == 0) {
    if (bVar110 != 0) goto LAB_003d1c84;
    fVar365 = ray->tfar;
    auVar181._4_4_ = -(uint)(fStack_184 <= fVar365);
    auVar181._0_4_ = -(uint)(local_188 <= fVar365);
    auVar181._8_4_ = -(uint)(fStack_180 <= fVar365);
    auVar181._12_4_ = -(uint)(fStack_17c <= fVar365);
    uVar112 = movmskps((int)uVar103,auVar181);
    uVar108 = (ulong)((uint)uVar108 & (uint)uVar108 + 0xf & uVar112);
    goto LAB_003cf7c9;
  }
  uVar114 = (int)uVar106 - 1;
  uVar103 = (ulong)uVar114;
  uVar113 = auStack_208[uVar103];
  local_408._0_4_ = afStack_58[uVar103 * 2];
  local_408._4_4_ = afStack_58[uVar103 * 2 + 1];
  fStack_400 = 0.0;
  fStack_3fc = 0.0;
  uVar11 = 0;
  if (uVar113 != 0) {
    for (; (uVar113 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
    }
  }
  uVar113 = uVar113 - 1 & uVar113;
  auStack_208[uVar103] = uVar113;
  if (uVar113 == 0) {
    uVar106 = (ulong)uVar114;
  }
  fVar213 = (float)(uVar11 + 1) * 0.33333334;
  fVar215 = auVar134._4_4_ * 0.0;
  fVar218 = auVar176._4_4_ * 0.0;
  fVar365 = afStack_78[uVar103 * 2];
  fVar116 = afStack_78[uVar103 * 2 + 1];
  fVar144 = fVar365 * (1.0 - (float)uVar11 * 0.33333334) + fVar116 * (float)uVar11 * 0.33333334;
  fVar213 = fVar365 * (1.0 - fVar213) + fVar116 * fVar213;
  fVar219 = fVar365 * (0.0 - fVar215) + fVar116 * fVar215;
  fVar218 = fVar365 * (0.0 - fVar218) + fVar116 * fVar218;
  fVar215 = fVar213 - fVar144;
  fVar187 = (float)local_348;
  fVar230 = local_348._4_4_;
  fVar365 = (float)uStack_340;
  fVar116 = uStack_340._4_4_;
  if (fVar215 < 0.16666667) {
    fVar355 = 1.0 - (float)local_408._0_4_;
    fVar301 = 1.0 - (float)local_408._0_4_;
    fVar348 = 1.0 - (float)local_408._4_4_;
    fVar231 = 1.0 - (float)local_408._4_4_;
    fVar275 = local_308._0_4_ * fVar355 + local_328 * (float)local_408._0_4_;
    fVar280 = local_308._4_4_ * fVar301 + fStack_324 * (float)local_408._0_4_;
    fVar305 = local_308._8_4_ * fVar348 + fStack_320 * (float)local_408._4_4_;
    fVar363 = local_308._12_4_ * fVar231 + fStack_31c * (float)local_408._4_4_;
    fVar228 = local_318._0_4_ * fVar355 + (float)local_2d8._0_4_ * (float)local_408._0_4_;
    fVar229 = local_318._4_4_ * fVar301 + (float)local_2d8._4_4_ * (float)local_408._0_4_;
    fVar261 = local_318._8_4_ * fVar348 + fStack_2d0 * (float)local_408._4_4_;
    fVar273 = local_318._12_4_ * fVar231 + fStack_2cc * (float)local_408._4_4_;
    fVar335 = (float)local_348 * fVar355 + local_2e8 * (float)local_408._0_4_;
    fVar368 = local_348._4_4_ * fVar301 + fStack_2e4 * (float)local_408._0_4_;
    fVar378 = (float)uStack_340 * fVar348 + fStack_2e0 * (float)local_408._4_4_;
    fVar388 = uStack_340._4_4_ * fVar231 + fStack_2dc * (float)local_408._4_4_;
    fVar232 = (fVar355 * (float)local_2c8._0_4_ + (float)local_408._0_4_ * (float)local_2f8._0_4_) -
              fVar335;
    fVar318 = (fVar301 * (float)local_2c8._4_4_ + (float)local_408._0_4_ * (float)local_2f8._4_4_) -
              fVar368;
    fVar319 = (fVar348 * fStack_2c0 + (float)local_408._4_4_ * fStack_2f0) - fVar378;
    fVar320 = (fVar231 * fStack_2bc + (float)local_408._4_4_ * fStack_2ec) - fVar388;
    fVar355 = fVar144 * (fVar335 - fVar228) + fVar228;
    fVar301 = fVar144 * (fVar368 - fVar229) + fVar229;
    fVar348 = fVar144 * (fVar378 - fVar261) + fVar261;
    fVar231 = fVar144 * (fVar388 - fVar273) + fVar273;
    fVar337 = (fVar335 - fVar228) * fVar213 + fVar228;
    fVar377 = (fVar368 - fVar229) * fVar213 + fVar229;
    fVar379 = (fVar378 - fVar261) * fVar213 + fVar261;
    fVar390 = (fVar388 - fVar273) * fVar213 + fVar273;
    fVar392 = fVar144 * (fVar228 - fVar275) + fVar275;
    fVar394 = fVar144 * (fVar229 - fVar280) + fVar280;
    fVar400 = fVar144 * (fVar261 - fVar305) + fVar305;
    fVar401 = fVar144 * (fVar273 - fVar363) + fVar363;
    fVar392 = (fVar355 - fVar392) * fVar144 + fVar392;
    fVar394 = (fVar301 - fVar394) * fVar144 + fVar394;
    fVar400 = (fVar348 - fVar400) * fVar144 + fVar400;
    fVar401 = (fVar231 - fVar401) * fVar144 + fVar401;
    fVar355 = (((fVar144 * fVar232 + fVar335) - fVar355) * fVar144 + fVar355) - fVar392;
    fVar301 = (((fVar144 * fVar318 + fVar368) - fVar301) * fVar144 + fVar301) - fVar394;
    fVar348 = (((fVar144 * fVar319 + fVar378) - fVar348) * fVar144 + fVar348) - fVar400;
    fVar231 = (((fVar144 * fVar320 + fVar388) - fVar231) * fVar144 + fVar231) - fVar401;
    auVar209._0_4_ = fVar144 * fVar355 + fVar392;
    auVar209._4_4_ = fVar144 * fVar301 + fVar394;
    auVar209._8_4_ = fVar144 * fVar348 + fVar400;
    auVar209._12_4_ = fVar144 * fVar231 + fVar401;
    fVar275 = (fVar228 - fVar275) * fVar213 + fVar275;
    fVar280 = (fVar229 - fVar280) * fVar213 + fVar280;
    fVar305 = (fVar261 - fVar305) * fVar213 + fVar305;
    fVar363 = (fVar273 - fVar363) * fVar213 + fVar363;
    fVar275 = (fVar337 - fVar275) * fVar213 + fVar275;
    fVar280 = (fVar377 - fVar280) * fVar213 + fVar280;
    fVar305 = (fVar379 - fVar305) * fVar213 + fVar305;
    fVar363 = (fVar390 - fVar363) * fVar213 + fVar363;
    fVar229 = (((fVar232 * fVar213 + fVar335) - fVar337) * fVar213 + fVar337) - fVar275;
    fVar261 = (((fVar318 * fVar213 + fVar368) - fVar377) * fVar213 + fVar377) - fVar280;
    fVar273 = (((fVar319 * fVar213 + fVar378) - fVar379) * fVar213 + fVar379) - fVar305;
    fVar377 = (((fVar320 * fVar213 + fVar388) - fVar390) * fVar213 + fVar390) - fVar363;
    fVar275 = fVar213 * fVar229 + fVar275;
    fVar280 = fVar213 * fVar261 + fVar280;
    fVar305 = fVar213 * fVar273 + fVar305;
    fVar363 = fVar213 * fVar377 + fVar363;
    fVar228 = fVar215 * 0.33333334;
    fVar232 = fVar355 * (float)DAT_01f4afa0 * fVar228 + auVar209._0_4_;
    fVar318 = fVar301 * DAT_01f4afa0._4_4_ * fVar228 + auVar209._4_4_;
    fVar319 = fVar348 * DAT_01f4afa0._8_4_ * fVar228 + auVar209._8_4_;
    fVar320 = fVar231 * DAT_01f4afa0._12_4_ * fVar228 + auVar209._12_4_;
    fVar335 = fVar275 - fVar228 * fVar229 * (float)DAT_01f4afa0;
    fVar337 = fVar280 - fVar228 * fVar261 * DAT_01f4afa0._4_4_;
    fVar368 = fVar305 - fVar228 * fVar273 * DAT_01f4afa0._8_4_;
    fVar377 = fVar363 - fVar228 * fVar377 * DAT_01f4afa0._12_4_;
    auVar30._4_8_ = auVar384._8_8_;
    auVar30._0_4_ = auVar209._4_4_;
    auVar385._0_8_ = auVar30._0_8_ << 0x20;
    auVar385._8_4_ = auVar209._8_4_;
    auVar385._12_4_ = auVar209._12_4_;
    auVar386._8_8_ = auVar209._8_8_;
    auVar386._0_8_ = auVar385._8_8_;
    auVar31._4_8_ = DAT_01f4afa0._8_8_;
    auVar31._0_4_ = fVar280;
    auVar311._0_8_ = auVar31._0_8_ << 0x20;
    auVar311._8_4_ = fVar305;
    auVar311._12_4_ = fVar363;
    fVar355 = (fVar305 - fVar275) + (auVar209._8_4_ - auVar209._0_4_);
    fVar301 = (fVar363 - fVar280) + (auVar209._12_4_ - auVar209._4_4_);
    auVar330._0_4_ = fVar337 * fVar301;
    auVar330._4_4_ = fVar337 * fVar301;
    auVar330._8_4_ = fVar377 * fVar301;
    auVar330._12_4_ = fVar377 * fVar301;
    fVar228 = auVar209._0_4_ * fVar355 + auVar209._4_4_ * fVar301;
    fVar229 = auVar209._8_4_ * fVar355 + auVar209._12_4_ * fVar301;
    fVar348 = fVar232 * fVar355 + fVar318 * fVar301;
    fVar231 = fVar319 * fVar355 + fVar320 * fVar301;
    fVar378 = fVar335 * fVar355 + auVar330._0_4_;
    auVar296._0_8_ = CONCAT44(fVar337 * fVar355 + auVar330._4_4_,fVar378);
    auVar296._8_4_ = fVar368 * fVar355 + auVar330._8_4_;
    auVar296._12_4_ = fVar377 * fVar355 + auVar330._12_4_;
    fVar273 = fVar355 * fVar275 + fVar301 * fVar280;
    fVar379 = fVar355 * fVar305 + fVar301 * fVar363;
    auVar32._4_8_ = auVar330._8_8_;
    auVar32._0_4_ = fVar318 * fVar355 + fVar318 * fVar301;
    auVar331._0_8_ = auVar32._0_8_ << 0x20;
    auVar331._8_4_ = fVar231;
    auVar331._12_4_ = fVar320 * fVar355 + fVar320 * fVar301;
    fVar261 = fVar348;
    if (fVar348 <= fVar228) {
      fVar261 = fVar228;
      fVar228 = fVar348;
    }
    auVar332._8_8_ = auVar331._8_8_;
    auVar332._0_8_ = auVar332._8_8_;
    auVar132._8_4_ = auVar296._8_4_;
    auVar132._0_8_ = auVar296._0_8_;
    auVar132._12_4_ = auVar296._12_4_;
    if (fVar273 <= fVar378) {
      auVar132._0_4_ = fVar273;
    }
    if (auVar132._0_4_ <= fVar228) {
      fVar228 = auVar132._0_4_;
    }
    auVar33._4_8_ = auVar132._8_8_;
    auVar33._0_4_ = fVar355 * fVar280 + fVar301 * fVar280;
    auVar133._0_8_ = auVar33._0_8_ << 0x20;
    auVar133._8_4_ = fVar379;
    auVar133._12_4_ = fVar355 * fVar363 + fVar301 * fVar363;
    if (fVar273 <= fVar378) {
      fVar273 = fVar378;
    }
    auVar134._8_8_ = auVar133._8_8_;
    auVar134._0_8_ = auVar134._8_8_;
    if (fVar273 <= fVar261) {
      fVar273 = fVar261;
    }
    if (fVar231 <= fVar229) {
      auVar332._0_4_ = fVar229;
      fVar229 = fVar231;
    }
    auVar174._8_4_ = auVar296._8_4_;
    auVar174._0_8_ = auVar296._8_8_;
    auVar174._12_4_ = auVar296._12_4_;
    if (fVar379 <= auVar296._8_4_) {
      auVar174._0_4_ = fVar379;
    }
    if (auVar174._0_4_ <= fVar229) {
      fVar229 = auVar174._0_4_;
    }
    if (fVar379 <= auVar296._8_4_) {
      auVar134._0_4_ = auVar296._8_4_;
    }
    if (auVar134._0_4_ <= auVar332._0_4_) {
      auVar134._0_4_ = auVar332._0_4_;
    }
    bVar111 = 3 < (uint)uVar106;
    uVar34 = (undefined3)(uVar114 >> 8);
    uVar103 = (ulong)CONCAT31(uVar34,bVar111);
    fVar261 = auVar134._0_4_;
    if ((0.0001 <= fVar228) || (fVar261 <= -0.0001)) goto LAB_003d0eda;
    goto LAB_003d0f23;
  }
  goto LAB_003d055a;
LAB_003d0eda:
  auVar176._0_12_ = ZEXT812(0x38d1b717);
  auVar176._12_4_ = 0.0;
  if ((0.0001 <= fVar229 || fVar273 <= -0.0001) &&
     ((0.0001 <= fVar228 || fVar273 <= -0.0001 &&
      (auVar384 = auVar386, auVar131 = _local_3f8, 0.0001 <= fVar229 || fVar261 <= -0.0001))))
  goto LAB_003d0bbf;
LAB_003d0f23:
  local_3f8 = (undefined1  [8])auVar311._8_8_;
  auVar131 = _local_3f8;
  bVar111 = bVar111 || fVar215 < 0.001;
  uVar103 = (ulong)CONCAT31(uVar34,bVar111);
  fVar301 = (float)(~-(uint)(fVar228 < 0.0) & 0x3f800000 | -(uint)(fVar228 < 0.0) & 0xbf800000);
  fVar348 = (float)(~-(uint)(fVar273 < 0.0) & 0x3f800000 | -(uint)(fVar273 < 0.0) & 0xbf800000);
  fVar355 = 0.0;
  if ((fVar301 == fVar348) && (!NAN(fVar301) && !NAN(fVar348))) {
    fVar355 = INFINITY;
  }
  fVar231 = 0.0;
  if ((fVar301 == fVar348) && (!NAN(fVar301) && !NAN(fVar348))) {
    fVar231 = -INFINITY;
  }
  fVar378 = (float)(~-(uint)(fVar229 < 0.0) & 0x3f800000 | -(uint)(fVar229 < 0.0) & 0xbf800000);
  if ((fVar301 != fVar378) || (fVar379 = fVar231, NAN(fVar301) || NAN(fVar378))) {
    if ((fVar229 != fVar228) || (NAN(fVar229) || NAN(fVar228))) {
      fVar229 = -fVar228 / (fVar229 - fVar228);
      fVar229 = (1.0 - fVar229) * 0.0 + fVar229;
      fVar379 = fVar229;
    }
    else {
      fVar229 = 0.0;
      if ((fVar228 != 0.0) || (fVar379 = 1.0, NAN(fVar228))) {
        fVar229 = INFINITY;
        fVar379 = -INFINITY;
      }
    }
    if (fVar229 <= fVar355) {
      fVar355 = fVar229;
    }
    if (fVar379 <= fVar231) {
      fVar379 = fVar231;
    }
  }
  fVar228 = *(float *)(&DAT_01f4bed4 + (ulong)(fVar261 < 0.0) * 4);
  if ((fVar348 != fVar228) || (fVar229 = fVar379, NAN(fVar348) || NAN(fVar228))) {
    if ((fVar261 != fVar273) || (NAN(fVar261) || NAN(fVar273))) {
      fVar301 = -fVar273 / (fVar261 - fVar273);
      fVar301 = (1.0 - fVar301) * 0.0 + fVar301;
      fVar229 = fVar301;
    }
    else {
      fVar301 = 0.0;
      if ((fVar273 != 0.0) || (fVar229 = 1.0, NAN(fVar273))) {
        fVar301 = INFINITY;
        fVar229 = -INFINITY;
      }
    }
    if (fVar301 <= fVar355) {
      fVar355 = fVar301;
    }
    if (fVar229 <= fVar379) {
      fVar229 = fVar379;
    }
  }
  if ((fVar378 != fVar228) || (NAN(fVar378) || NAN(fVar228))) {
    fVar355 = (float)(~-(uint)(fVar355 < 1.0) & 0x3f800000 | (uint)fVar355 & -(uint)(fVar355 < 1.0))
    ;
    fVar229 = (float)(~-(uint)(fVar229 < 1.0) & (uint)fVar229 | -(uint)(fVar229 < 1.0) & 0x3f800000)
    ;
  }
  auVar384._0_12_ = ZEXT812(0x3f800000);
  auVar384._12_4_ = 0.0;
  auVar175._0_8_ =
       CONCAT44(~-(uint)(fVar229 < 1.0),~-(uint)(fVar355 < 0.0) & (uint)fVar355) &
       0x3f800000ffffffff;
  auVar175._8_8_ = 0;
  auVar176 = auVar175 | ZEXT416((uint)fVar229 & -(uint)(fVar229 < 1.0)) << 0x20;
  fVar228 = auVar176._4_4_;
  auVar134._4_4_ = fVar228;
  auVar134._0_4_ = fVar228;
  auVar134._8_4_ = fVar228;
  auVar134._12_4_ = fVar228;
  fStack_3f0 = auVar191._8_4_;
  fStack_3ec = auVar191._12_4_;
  _local_338 = auVar386;
  if (fVar228 < auVar176._0_4_) goto LAB_003d0bbf;
  fVar229 = auVar176._0_4_ + -0.1;
  fVar273 = auVar176._8_4_ + 0.0;
  fVar355 = auVar176._12_4_ + 0.0;
  uVar113 = -(uint)(fVar228 + 0.1 < 1.0);
  fVar229 = (float)(~-(uint)(fVar229 < 0.0) & (uint)fVar229);
  fVar228 = (float)(~uVar113 & 0x3f800000 | (uint)(fVar228 + 0.1) & uVar113);
  fVar390 = 1.0 - fVar229;
  fVar392 = 1.0 - fVar229;
  fVar394 = 1.0 - fVar228;
  fVar400 = 1.0 - fVar228;
  fVar301 = auVar209._0_4_ * fVar390 + auVar209._8_4_ * fVar229;
  fVar348 = auVar209._4_4_ * fVar392 + auVar209._12_4_ * fVar229;
  fVar231 = auVar209._0_4_ * fVar394 + auVar209._8_4_ * fVar228;
  fVar378 = auVar209._4_4_ * fVar400 + auVar209._12_4_ * fVar228;
  fVar379 = fVar232 * fVar390 + fVar319 * fVar229;
  fVar388 = fVar318 * fVar392 + fVar320 * fVar229;
  fVar232 = fVar232 * fVar394 + fVar319 * fVar228;
  fVar318 = fVar318 * fVar400 + fVar320 * fVar228;
  fVar319 = fVar335 * fVar390 + fVar368 * fVar229;
  fVar320 = fVar337 * fVar392 + fVar377 * fVar229;
  fVar335 = fVar335 * fVar394 + fVar368 * fVar228;
  fVar337 = fVar337 * fVar400 + fVar377 * fVar228;
  fVar368 = fVar390 * fVar275 + fVar305 * fVar229;
  fVar377 = fVar392 * fVar280 + fVar363 * fVar229;
  fVar390 = fVar394 * fVar275 + fStack_3f0 * fVar228;
  fVar392 = fVar400 * fVar280 + fStack_3ec * fVar228;
  fVar275 = (float)local_408._4_4_ * fVar273;
  fVar280 = (float)local_408._4_4_ * fVar355;
  fVar394 = (float)local_408._0_4_ * (1.0 - fVar228);
  fStack_400 = (float)local_408._0_4_ * (0.0 - fVar273);
  fStack_3fc = (float)local_408._0_4_ * (0.0 - fVar355);
  local_408._0_4_ = (float)local_408._0_4_ * (1.0 - fVar229) + (float)local_408._4_4_ * fVar229;
  local_408._4_4_ = fVar394 + (float)local_408._4_4_ * fVar228;
  fStack_400 = fStack_400 + fVar275;
  fStack_3fc = fStack_3fc + fVar280;
  fVar215 = 1.0 / fVar215;
  auVar177._0_4_ = fVar390 - fVar368;
  auVar177._4_4_ = fVar392 - fVar377;
  auVar177._8_4_ = fVar390 - fVar390;
  auVar177._12_4_ = fVar392 - fVar392;
  auVar225._0_8_ = CONCAT44(fVar337 - fVar320,fVar335 - fVar319);
  auVar225._8_4_ = fVar335 - fVar335;
  auVar225._12_4_ = fVar337 - fVar337;
  auVar268._0_4_ = fVar232 - fVar379;
  auVar268._4_4_ = fVar318 - fVar388;
  auVar268._8_4_ = fVar232 - fVar232;
  auVar268._12_4_ = fVar318 - fVar318;
  auVar333._0_8_ = CONCAT44((fVar388 - fVar348) * 3.0,(fVar379 - fVar301) * 3.0);
  auVar333._8_4_ = (fVar232 - fVar231) * 3.0;
  auVar333._12_4_ = (fVar318 - fVar378) * 3.0;
  auVar251._0_8_ = CONCAT44((fVar320 - fVar388) * 3.0,(fVar319 - fVar379) * 3.0);
  auVar251._8_4_ = (fVar335 - fVar232) * 3.0;
  auVar251._12_4_ = (fVar337 - fVar318) * 3.0;
  auVar359._0_4_ = (fVar368 - fVar319) * 3.0;
  auVar359._4_4_ = (fVar377 - fVar320) * 3.0;
  auVar359._8_4_ = (fVar390 - fVar335) * 3.0;
  auVar359._12_4_ = (fVar392 - fVar337) * 3.0;
  auVar297._8_4_ = auVar251._8_4_;
  auVar297._0_8_ = auVar251._0_8_;
  auVar297._12_4_ = auVar251._12_4_;
  auVar235 = minps(auVar297,auVar359);
  auVar191 = maxps(auVar251,auVar359);
  auVar344._8_4_ = auVar333._8_4_;
  auVar344._0_8_ = auVar333._0_8_;
  auVar344._12_4_ = auVar333._12_4_;
  auVar203 = minps(auVar344,auVar235);
  auVar170 = maxps(auVar333,auVar191);
  auVar35._4_8_ = auVar191._8_8_;
  auVar35._0_4_ = auVar203._4_4_;
  auVar252._0_8_ = auVar35._0_8_ << 0x20;
  auVar252._8_4_ = auVar203._8_4_;
  auVar252._12_4_ = auVar203._12_4_;
  auVar253._8_8_ = auVar203._8_8_;
  auVar253._0_8_ = auVar252._8_8_;
  auVar36._4_8_ = auVar235._8_8_;
  auVar36._0_4_ = auVar170._4_4_;
  auVar298._0_8_ = auVar36._0_8_ << 0x20;
  auVar298._8_4_ = auVar170._8_4_;
  auVar298._12_4_ = auVar170._12_4_;
  auVar299._8_8_ = auVar170._8_8_;
  auVar299._0_8_ = auVar298._8_8_;
  auVar235 = minps(auVar203,auVar253);
  auVar191 = maxps(auVar170,auVar299);
  fVar400 = auVar235._0_4_ * fVar215;
  fVar401 = auVar235._4_4_ * fVar215;
  fVar402 = auVar235._8_4_ * fVar215;
  fVar403 = auVar235._12_4_ * fVar215;
  fVar320 = fVar215 * auVar191._0_4_;
  fVar337 = fVar215 * auVar191._4_4_;
  fVar377 = fVar215 * auVar191._8_4_;
  fVar215 = fVar215 * auVar191._12_4_;
  fVar392 = 1.0 / ((float)local_408._4_4_ - (float)local_408._0_4_);
  auVar135._0_8_ = CONCAT44(fVar378 - fVar348,fVar231 - fVar301);
  auVar135._8_4_ = fVar231 - fVar231;
  auVar135._12_4_ = fVar378 - fVar378;
  auVar312._8_4_ = auVar135._8_4_;
  auVar312._0_8_ = auVar135._0_8_;
  auVar312._12_4_ = auVar135._12_4_;
  auVar170 = minps(auVar312,auVar268);
  auVar191 = maxps(auVar135,auVar268);
  auVar210._8_4_ = auVar225._8_4_;
  auVar210._0_8_ = auVar225._0_8_;
  auVar210._12_4_ = auVar225._12_4_;
  auVar235 = minps(auVar210,auVar177);
  auVar170 = minps(auVar170,auVar235);
  auVar235 = maxps(auVar225,auVar177);
  auVar191 = maxps(auVar191,auVar235);
  fVar388 = auVar170._0_4_ * fVar392;
  fVar390 = auVar170._4_4_ * fVar392;
  fVar394 = fVar392 * auVar191._0_4_;
  fVar392 = fVar392 * auVar191._4_4_;
  local_3f8._4_4_ = local_408._0_4_;
  local_3f8._0_4_ = fVar144;
  fStack_3f0 = fVar213;
  fStack_3ec = (float)local_408._4_4_;
  auVar300._4_4_ = local_408._4_4_;
  auVar300._0_4_ = fVar213;
  auVar300._8_4_ = fVar219;
  auVar300._12_4_ = fVar218;
  fVar231 = (fVar144 + fVar213) * 0.5;
  fVar232 = ((float)local_408._0_4_ + (float)local_408._4_4_) * 0.5;
  fVar318 = (fVar213 + fVar219) * 0.0;
  fVar319 = ((float)local_408._4_4_ + fVar218) * 0.0;
  fVar228 = local_88 * fVar231 + fVar305;
  fVar229 = fStack_84 * fVar231 + fVar363;
  fVar273 = fStack_80 * fVar231 + fVar145;
  fVar275 = fStack_7c * fVar231 + fVar188;
  fVar355 = local_98 * fVar231 + local_2a8;
  fVar280 = fStack_94 * fVar231 + fStack_2a4;
  fVar301 = fStack_90 * fVar231 + (float)uStack_2a0;
  fVar348 = fStack_8c * fVar231 + uStack_2a0._4_4_;
  fVar228 = (fVar355 - fVar228) * fVar231 + fVar228;
  fVar229 = (fVar280 - fVar229) * fVar231 + fVar229;
  fVar273 = (fVar301 - fVar273) * fVar231 + fVar273;
  fVar275 = (fVar348 - fVar275) * fVar231 + fVar275;
  fVar355 = (((local_a8 * fVar231 + (float)local_2b8) - fVar355) * fVar231 + fVar355) - fVar228;
  fVar280 = (((fStack_a4 * fVar231 + local_2b8._4_4_) - fVar280) * fVar231 + fVar280) - fVar229;
  fVar301 = (((fStack_a0 * fVar231 + fStack_2b0) - fVar301) * fVar231 + fVar301) - fVar273;
  fVar348 = (((fStack_9c * fVar231 + fStack_2ac) - fVar348) * fVar231 + fVar348) - fVar275;
  fVar228 = fVar231 * fVar355 + fVar228;
  fVar229 = fVar231 * fVar280 + fVar229;
  fVar355 = fVar355 * 3.0;
  fVar280 = fVar280 * 3.0;
  fVar273 = (fVar231 * fVar301 + fVar273) - fVar228;
  fVar275 = (fVar231 * fVar348 + fVar275) - fVar229;
  fVar355 = (fVar301 * 3.0 - fVar355) * fVar232 + fVar355;
  fVar280 = (fVar348 * 3.0 - fVar280) * fVar232 + fVar280;
  auVar226._0_8_ = CONCAT44(fVar355,fVar273) ^ 0x80000000;
  auVar226._8_4_ = fVar355;
  auVar226._12_4_ = fVar355;
  fVar409 = fVar144 - fVar231;
  fVar410 = (float)local_408._0_4_ - fVar232;
  fVar411 = fVar213 - fVar318;
  fVar216 = (float)local_408._4_4_ - fVar319;
  fVar217 = fVar213 - fVar231;
  fVar356 = (float)local_408._4_4_ - fVar232;
  fVar219 = fVar219 - fVar318;
  fVar218 = fVar218 - fVar319;
  fVar228 = fVar273 * fVar232 + fVar228;
  fVar229 = fVar275 * fVar232 + fVar229;
  auVar254._0_8_ = CONCAT44(fVar280,fVar275) ^ 0x8000000000000000;
  auVar254._8_4_ = -fVar280;
  auVar254._12_4_ = -fVar280;
  auVar136._0_4_ = fVar275 * fVar355 - fVar280 * fVar273;
  auVar136._4_4_ = auVar136._0_4_;
  auVar136._8_4_ = auVar136._0_4_;
  auVar136._12_4_ = auVar136._0_4_;
  auVar235 = divps(auVar254,auVar136);
  auVar191 = divps(auVar226,auVar136);
  fVar318 = auVar235._0_4_;
  fVar319 = auVar235._4_4_;
  fVar301 = auVar191._0_4_;
  fVar348 = auVar191._4_4_;
  fVar231 = fVar231 - (fVar229 * fVar301 + fVar228 * fVar318);
  fVar355 = fVar232 - (fVar229 * fVar348 + fVar228 * fVar319);
  fVar280 = fVar232 - (fVar229 * auVar191._8_4_ + fVar228 * auVar235._8_4_);
  fVar232 = fVar232 - (fVar229 * auVar191._12_4_ + fVar228 * auVar235._12_4_);
  auVar178._0_8_ = CONCAT44(fVar319 * fVar388,fVar319 * fVar400);
  auVar178._8_4_ = fVar319 * fVar401;
  auVar178._12_4_ = fVar319 * fVar390;
  auVar137._0_4_ = fVar319 * fVar320;
  auVar137._4_4_ = fVar319 * fVar394;
  auVar137._8_4_ = fVar319 * fVar337;
  auVar137._12_4_ = fVar319 * fVar392;
  auVar408._8_4_ = auVar178._8_4_;
  auVar408._0_8_ = auVar178._0_8_;
  auVar408._12_4_ = auVar178._12_4_;
  auVar203 = minps(auVar408,auVar137);
  auVar191 = maxps(auVar137,auVar178);
  auVar269._0_8_ = CONCAT44(fVar348 * fVar390,fVar348 * fVar401);
  auVar269._8_4_ = fVar348 * fVar402;
  auVar269._12_4_ = fVar348 * fVar403;
  auVar179._0_4_ = fVar348 * fVar337;
  auVar179._4_4_ = fVar348 * fVar392;
  auVar179._8_4_ = fVar348 * fVar377;
  auVar179._12_4_ = fVar348 * fVar215;
  auVar345._8_4_ = auVar269._8_4_;
  auVar345._0_8_ = auVar269._0_8_;
  auVar345._12_4_ = auVar269._12_4_;
  auVar170 = minps(auVar345,auVar179);
  auVar235 = maxps(auVar179,auVar269);
  fVar228 = 0.0 - (auVar235._0_4_ + auVar191._0_4_);
  fVar229 = 1.0 - (auVar235._4_4_ + auVar191._4_4_);
  fVar273 = 0.0 - (auVar235._8_4_ + auVar191._8_4_);
  fVar275 = 0.0 - (auVar235._12_4_ + auVar191._12_4_);
  fVar335 = 0.0 - (auVar170._0_4_ + auVar203._0_4_);
  fVar368 = 1.0 - (auVar170._4_4_ + auVar203._4_4_);
  fVar378 = 0.0 - (auVar170._8_4_ + auVar203._8_4_);
  fVar379 = 0.0 - (auVar170._12_4_ + auVar203._12_4_);
  auVar180._0_8_ = CONCAT44(fVar410 * fVar229,fVar409 * fVar228);
  auVar180._8_4_ = fVar411 * fVar273;
  auVar180._12_4_ = fVar216 * fVar275;
  auVar360._0_8_ = CONCAT44(fVar388 * fVar318,fVar400 * fVar318);
  auVar360._8_4_ = fVar401 * fVar318;
  auVar360._12_4_ = fVar390 * fVar318;
  auVar270._0_4_ = fVar318 * fVar320;
  auVar270._4_4_ = fVar318 * fVar394;
  auVar270._8_4_ = fVar318 * fVar337;
  auVar270._12_4_ = fVar318 * fVar392;
  auVar346._8_4_ = auVar360._8_4_;
  auVar346._0_8_ = auVar360._0_8_;
  auVar346._12_4_ = auVar360._12_4_;
  auVar235 = minps(auVar346,auVar270);
  auVar191 = maxps(auVar270,auVar360);
  auVar313._0_8_ = CONCAT44(fVar390 * fVar301,fVar401 * fVar301);
  auVar313._8_4_ = fVar402 * fVar301;
  auVar313._12_4_ = fVar403 * fVar301;
  auVar361._0_4_ = fVar301 * fVar337;
  auVar361._4_4_ = fVar301 * fVar392;
  auVar361._8_4_ = fVar301 * fVar377;
  auVar361._12_4_ = fVar301 * fVar215;
  auVar399._8_4_ = auVar313._8_4_;
  auVar399._0_8_ = auVar313._0_8_;
  auVar399._12_4_ = auVar313._12_4_;
  auVar203 = minps(auVar399,auVar361);
  auVar347._0_4_ = fVar409 * fVar335;
  auVar347._4_4_ = fVar410 * fVar368;
  auVar347._8_4_ = fVar411 * fVar378;
  auVar347._12_4_ = fVar216 * fVar379;
  auVar138._0_8_ = CONCAT44(fVar229 * fVar356,fVar228 * fVar217);
  auVar138._8_4_ = fVar273 * fVar219;
  auVar138._12_4_ = fVar275 * fVar218;
  auVar279._0_4_ = fVar335 * fVar217;
  auVar279._4_4_ = fVar368 * fVar356;
  auVar279._8_4_ = fVar378 * fVar219;
  auVar279._12_4_ = fVar379 * fVar218;
  auVar170 = maxps(auVar361,auVar313);
  fVar215 = 1.0 - (auVar170._0_4_ + auVar191._0_4_);
  fVar228 = 0.0 - (auVar170._4_4_ + auVar191._4_4_);
  fVar229 = 0.0 - (auVar170._8_4_ + auVar191._8_4_);
  fVar273 = 0.0 - (auVar170._12_4_ + auVar191._12_4_);
  fVar275 = 1.0 - (auVar203._0_4_ + auVar235._0_4_);
  fVar320 = 0.0 - (auVar203._4_4_ + auVar235._4_4_);
  fVar335 = 0.0 - (auVar203._8_4_ + auVar235._8_4_);
  fVar337 = 0.0 - (auVar203._12_4_ + auVar235._12_4_);
  auVar314._0_8_ = CONCAT44(fVar410 * fVar228,fVar409 * fVar215);
  auVar314._8_4_ = fVar411 * fVar229;
  auVar314._12_4_ = fVar216 * fVar273;
  auVar376._0_4_ = fVar409 * fVar275;
  auVar376._4_4_ = fVar410 * fVar320;
  auVar376._8_4_ = fVar411 * fVar335;
  auVar376._12_4_ = fVar216 * fVar337;
  auVar271._0_8_ = CONCAT44(fVar228 * fVar356,fVar215 * fVar217);
  auVar271._8_4_ = fVar229 * fVar219;
  auVar271._12_4_ = fVar273 * fVar218;
  auVar334._0_4_ = fVar275 * fVar217;
  auVar334._4_4_ = fVar320 * fVar356;
  auVar334._8_4_ = fVar335 * fVar219;
  auVar334._12_4_ = fVar337 * fVar218;
  auVar362._8_4_ = auVar314._8_4_;
  auVar362._0_8_ = auVar314._0_8_;
  auVar362._12_4_ = auVar314._12_4_;
  auVar191 = minps(auVar362,auVar376);
  auVar387._8_4_ = auVar271._8_4_;
  auVar387._0_8_ = auVar271._0_8_;
  auVar387._12_4_ = auVar271._12_4_;
  auVar235 = minps(auVar387,auVar334);
  auVar329 = minps(auVar191,auVar235);
  auVar384._0_12_ = ZEXT812(0x3f800000);
  auVar384._12_4_ = 0.0;
  auVar235 = maxps(auVar376,auVar314);
  auVar191 = maxps(auVar334,auVar271);
  auVar170 = maxps(auVar191,auVar235);
  auVar315._8_4_ = auVar180._8_4_;
  auVar315._0_8_ = auVar180._0_8_;
  auVar315._12_4_ = auVar180._12_4_;
  auVar235 = minps(auVar315,auVar347);
  auVar272._8_4_ = auVar138._8_4_;
  auVar272._0_8_ = auVar138._0_8_;
  auVar272._12_4_ = auVar138._12_4_;
  auVar191 = minps(auVar272,auVar279);
  auVar235 = minps(auVar235,auVar191);
  auVar203 = maxps(auVar347,auVar180);
  auVar191 = maxps(auVar279,auVar138);
  auVar191 = maxps(auVar191,auVar203);
  auVar316._0_4_ = auVar329._4_4_ + auVar329._0_4_ + fVar231;
  auVar316._4_4_ = auVar235._4_4_ + auVar235._0_4_ + fVar355;
  auVar316._8_4_ = auVar329._8_4_ + auVar329._4_4_ + fVar280;
  auVar316._12_4_ = auVar329._12_4_ + auVar235._4_4_ + fVar232;
  fVar215 = auVar170._4_4_ + auVar170._0_4_ + fVar231;
  fVar218 = auVar191._4_4_ + auVar191._0_4_ + fVar355;
  auVar139._4_4_ = fVar218;
  auVar139._0_4_ = fVar215;
  auVar176 = maxps(_local_3f8,auVar316);
  auVar139._8_4_ = auVar170._8_4_ + auVar170._4_4_ + fVar280;
  auVar139._12_4_ = auVar170._12_4_ + auVar191._4_4_ + fVar232;
  auVar191 = minps(auVar139,auVar300);
  iVar147 = -(uint)(auVar191._0_4_ < auVar176._0_4_);
  iVar182 = -(uint)(auVar191._4_4_ < auVar176._4_4_);
  auVar140._4_4_ = iVar182;
  auVar140._0_4_ = iVar147;
  auVar140._8_4_ = iVar182;
  auVar140._12_4_ = iVar182;
  auVar134._8_8_ = auVar140._8_8_;
  auVar134._4_4_ = (float)iVar147;
  auVar134._0_4_ = (float)iVar147;
  iVar147 = movmskpd((uint)(fVar261 < 0.0),auVar134);
  auVar131 = _local_3f8;
  if (iVar147 != 0) goto LAB_003d0bbf;
  bVar101 = 0;
  if ((fVar144 < auVar316._0_4_) && (fVar215 < fVar213)) {
    bVar101 = -(fVar218 < (float)local_408._4_4_) & (float)local_408._0_4_ < auVar316._4_4_;
  }
  bVar101 = bVar111 | bVar101;
  uVar103 = (ulong)CONCAT31(uVar34,bVar101);
  if (bVar101 != 1) goto LAB_003d055a;
  uVar103 = 0xc9;
  do {
    uVar103 = uVar103 - 1;
    if (uVar103 == 0) goto LAB_003d0bbf;
    fVar116 = 1.0 - fVar231;
    fVar218 = fVar231 * fVar231 * fVar231;
    fVar215 = fVar231 * fVar231 * 3.0 * fVar116;
    fVar365 = fVar116 * fVar116 * fVar116;
    fVar219 = fVar231 * 3.0 * fVar116 * fVar116;
    fVar116 = fVar365 * fVar305 +
              fVar219 * local_2a8 + fVar215 * (float)local_2b8 + fVar218 * local_b8._0_4_;
    fVar144 = fVar365 * fVar363 +
              fVar219 * fStack_2a4 + fVar215 * local_2b8._4_4_ + fVar218 * local_b8._4_4_;
    fVar213 = fVar365 * fVar145 +
              fVar219 * (float)uStack_2a0 + fVar215 * fStack_2b0 + fVar218 * local_b8._8_4_;
    fVar215 = fVar365 * fVar188 +
              fVar219 * uStack_2a0._4_4_ + fVar215 * fStack_2ac + fVar218 * local_b8._12_4_;
    fVar218 = (fVar213 - fVar116) * fVar355;
    fVar219 = (fVar215 - fVar144) * fVar355;
    fVar365 = (fVar213 - fVar116) * fVar355 + fVar116;
    fVar213 = (fVar215 - fVar144) * fVar355 + fVar144;
    fVar231 = fVar231 - (fVar213 * fVar301 + fVar365 * fVar318);
    fVar355 = fVar355 - (fVar213 * fVar348 + fVar365 * fVar319);
    fVar215 = ABS(fVar213);
    auVar134._0_8_ = CONCAT44(fVar213,fVar365) & 0x7fffffff7fffffff;
    auVar134._8_4_ = ABS(fVar218 + fVar116);
    auVar134._12_4_ = ABS(fVar219 + fVar144);
    auVar176._0_8_ = CONCAT44(fVar213,fVar213) & 0x7fffffff7fffffff;
    auVar176._8_4_ = fVar215;
    auVar176._12_4_ = fVar215;
    if (fVar215 <= ABS(fVar365)) {
      auVar176._0_4_ = ABS(fVar365);
    }
  } while (local_c8 <= auVar176._0_4_);
  if ((((fVar231 < 0.0) || (1.0 < fVar231)) ||
      (auVar176._4_4_ = fVar355, auVar176._0_4_ = fVar355, auVar176._8_4_ = fVar355,
      auVar176._12_4_ = fVar355, fVar355 < 0.0)) || (1.0 < fVar355)) goto LAB_003d0bbf;
  fVar365 = (pre->ray_space).vx.field_0.m128[2];
  fVar116 = (pre->ray_space).vy.field_0.m128[2];
  fVar144 = (pre->ray_space).vz.field_0.m128[2];
  fVar213 = (ray->org).field_0.m128[0];
  fVar215 = (ray->org).field_0.m128[1];
  fVar218 = (ray->org).field_0.m128[2];
  fVar219 = (ray->org).field_0.m128[3];
  auVar141._0_4_ = (local_378 - fVar213) * fVar365;
  auVar141._4_4_ = (fStack_374 - fVar215) * fVar116;
  auVar141._8_4_ = (fStack_370 - fVar218) * fVar144;
  auVar141._12_4_ = (fStack_36c - fVar219) * 0.0;
  auVar142._8_8_ = auVar141._8_8_;
  auVar142._0_8_ = auVar142._8_8_;
  auVar134._4_12_ = auVar142._4_12_;
  fVar273 = 1.0 - fVar355;
  fVar261 = 1.0 - fVar231;
  fVar228 = fVar261 * fVar261 * fVar261;
  fVar229 = fVar231 * 3.0 * fVar261 * fVar261;
  fVar230 = fVar231 * fVar231 * fVar231;
  fVar187 = fVar231 * fVar231 * 3.0 * fVar261;
  auVar134._0_4_ =
       ((auVar141._8_4_ + auVar141._4_4_ + auVar141._0_4_) * fVar273 +
       ((fStack_360 - fVar218) * fVar144 +
       (fStack_364 - fVar215) * fVar116 + (local_368 - fVar213) * fVar365) * fVar355) * fVar228 +
       (((fStack_380 - fVar218) * fVar144 +
        (fStack_384 - fVar215) * fVar116 + (local_388 - fVar213) * fVar365) * fVar273 +
       ((fStack_350 - fVar218) * fVar144 +
       (fStack_354 - fVar215) * fVar116 + (local_358 - fVar213) * fVar365) * fVar355) * fVar229 +
       (((fStack_3a0 - fVar218) * fVar144 +
        (fStack_3a4 - fVar215) * fVar116 + (local_3a8 - fVar213) * fVar365) * fVar273 +
       ((fStack_3b0 - fVar218) * fVar144 +
       (fStack_3b4 - fVar215) * fVar116 + (local_3b8 - fVar213) * fVar365) * fVar355) * fVar187 +
       (fVar273 * ((fStack_390 - fVar218) * fVar144 +
                  (fStack_394 - fVar215) * fVar116 + (local_398 - fVar213) * fVar365) +
       ((fStack_210 - fVar218) * fVar144 +
       (fStack_214 - fVar215) * fVar116 + (local_218 - fVar213) * fVar365) * fVar355) * fVar230;
  if (auVar134._0_4_ < fVar219) goto LAB_003d0bbf;
  fVar365 = ray->tfar;
  auVar384 = ZEXT416((uint)fVar365);
  if (fVar365 < auVar134._0_4_) goto LAB_003d0bbf;
  fVar218 = 1.0 - fVar355;
  fVar219 = 1.0 - fVar355;
  fVar273 = 1.0 - fVar355;
  fVar275 = 1.0 - fVar355;
  fVar116 = local_388 * fVar218 + local_358 * fVar355;
  fVar144 = fStack_384 * fVar219 + fStack_354 * fVar355;
  fVar213 = fStack_380 * fVar273 + fStack_350 * fVar355;
  fVar215 = fStack_37c * fVar275 + fStack_34c * fVar355;
  fVar280 = local_3a8 * fVar218 + local_3b8 * fVar355;
  fVar305 = fStack_3a4 * fVar219 + fStack_3b4 * fVar355;
  fVar348 = fStack_3a0 * fVar273 + fStack_3b0 * fVar355;
  fVar318 = fStack_39c * fVar275 + fStack_3ac * fVar355;
  fVar301 = fVar280 - fVar116;
  fVar363 = fVar305 - fVar144;
  fVar232 = fVar348 - fVar213;
  fVar319 = fVar318 - fVar215;
  auVar176._4_4_ = fVar231;
  auVar176._0_4_ = fVar231;
  auVar176._8_4_ = fVar231;
  auVar176._12_4_ = fVar231;
  fVar116 = (((fVar116 - (local_378 * fVar218 + local_368 * fVar355)) * fVar261 + fVar231 * fVar301)
             * fVar261 +
            (fVar301 * fVar261 + ((fVar218 * local_398 + fVar355 * local_218) - fVar280) * fVar231)
            * fVar231) * 3.0;
  fVar144 = (((fVar144 - (fStack_374 * fVar219 + fStack_364 * fVar355)) * fVar261 +
             fVar231 * fVar363) * fVar261 +
            (fVar363 * fVar261 + ((fVar219 * fStack_394 + fVar355 * fStack_214) - fVar305) * fVar231
            ) * fVar231) * 3.0;
  fVar213 = (((fVar213 - (fStack_370 * fVar273 + fStack_360 * fVar355)) * fVar261 +
             fVar231 * fVar232) * fVar261 +
            (fVar232 * fVar261 + ((fVar273 * fStack_390 + fVar355 * fStack_210) - fVar348) * fVar231
            ) * fVar231) * 3.0;
  fVar215 = (((fVar215 - (fStack_36c * fVar275 + fStack_35c * fVar355)) * fVar261 +
             fVar231 * fVar319) * fVar261 +
            (fVar319 * fVar261 + ((fVar275 * fStack_38c + fVar355 * fStack_20c) - fVar318) * fVar231
            ) * fVar231) * 3.0;
  pGVar21 = (context->scene->geometries).items[uVar112].ptr;
  if ((pGVar21->mask & ray->mask) != 0) {
    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
       (uVar103 = CONCAT71((int7)((ulong)context->args >> 8),1),
       pGVar21->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_003d1bbe;
    fVar218 = fVar228 * local_198 + fVar229 * local_1a8 + fVar187 * local_1b8 + fVar230 * local_1c8;
    fVar219 = fVar228 * fStack_194 +
              fVar229 * fStack_1a4 + fVar187 * fStack_1b4 + fVar230 * fStack_1c4;
    fVar261 = fVar228 * fStack_190 +
              fVar229 * fStack_1a0 + fVar187 * fStack_1b0 + fVar230 * fStack_1c0;
    fVar228 = fVar228 * fStack_18c +
              fVar229 * fStack_19c + fVar187 * fStack_1ac + fVar230 * fStack_1bc;
    auVar176._0_4_ = fVar219 * fVar116 - fVar144 * fVar218;
    auVar176._4_4_ = fVar261 * fVar144 - fVar213 * fVar219;
    auVar176._8_4_ = fVar218 * fVar213 - fVar116 * fVar261;
    auVar176._12_4_ = fVar228 * fVar215 - fVar215 * fVar228;
    local_1f8 = CONCAT44(auVar176._8_4_,auVar176._4_4_);
    local_1f0 = auVar176._0_4_;
    local_1ec = fVar231;
    fStack_1e8 = fVar355;
    local_1e4 = (int)local_298;
    local_1e0 = uVar112;
    local_1dc = context->user->instID[0];
    local_1d8 = context->user->instPrimID[0];
    ray->tfar = auVar134._0_4_;
    local_3bc = 0xffffffff;
    local_288.valid = &local_3bc;
    local_288.geometryUserPtr = pGVar21->userPtr;
    local_288.context = context->user;
    local_288.hit = (RTCHitN *)&local_1f8;
    local_288.N = 1;
    local_288.ray = (RTCRayN *)ray;
    if (pGVar21->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_003d1b71:
      p_Var104 = context->args->filter;
      if ((p_Var104 != (RTCFilterFunctionN)0x0) &&
         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
           RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar21->field_8).field_0x2 & 0x40) != 0)))) {
        auVar191 = (*p_Var104)(&local_288);
        auVar176._0_8_ = auVar191._8_8_;
        auVar134._0_8_ = auVar191._0_8_;
        auVar176._8_8_ = extraout_XMM1_Qb_00;
        auVar134._8_8_ = extraout_XMM0_Qb_00;
        p_Var104 = (RTCFilterFunctionN)local_288.valid;
        if (*local_288.valid == 0) goto LAB_003d1bb0;
      }
      uVar103 = CONCAT71((int7)((ulong)p_Var104 >> 8),1);
      goto LAB_003d1bbe;
    }
    auVar191 = (*pGVar21->occlusionFilterN)(&local_288);
    auVar176._0_8_ = auVar191._8_8_;
    auVar134._0_8_ = auVar191._0_8_;
    auVar176._8_8_ = extraout_XMM1_Qb;
    auVar134._8_8_ = extraout_XMM0_Qb;
    if (*local_288.valid != 0) goto LAB_003d1b71;
LAB_003d1bb0:
    auVar134 = ZEXT416((uint)fVar365);
    ray->tfar = fVar365;
  }
  uVar103 = 0;
LAB_003d1bbe:
  bVar110 = bVar110 | (byte)uVar103;
  goto LAB_003d0bbf;
}

Assistant:

static __forceinline bool occluded_n(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray.org, primID,ray.time());

          if (Intersector().intersect(pre,ray,context,geom,primID,curve,Epilog(ray,context,geomID,primID)))
              return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }